

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  undefined8 uVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar89 [32];
  int iVar90;
  float t1;
  undefined4 uVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vfloat4 a0_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 a0_3;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  __m128 a_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  __m128 a;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar193;
  float fVar195;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  vfloat4 a0_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  float fVar217;
  float fVar218;
  vfloat4 a0;
  undefined1 auVar211 [16];
  float fVar219;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  long local_338;
  Primitive *local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  RayQueryContext *local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_14c;
  undefined4 local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar223 [32];
  
  PVar4 = prim[1];
  uVar25 = (ulong)(byte)PVar4;
  fVar201 = *(float *)(prim + uVar25 * 0x19 + 0x12);
  auVar39 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar25 * 0x19 + 6));
  fVar106 = fVar201 * (ray->dir).field_0.m128[0];
  fVar114 = fVar201 * auVar39._0_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar25 * 4 + 6);
  auVar59 = vpmovsxbd_avx2(auVar34);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar25 * 5 + 6);
  auVar58 = vpmovsxbd_avx2(auVar44);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar25 * 6 + 6);
  auVar64 = vpmovsxbd_avx2(auVar45);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar25 * 0xb + 6);
  auVar72 = vpmovsxbd_avx2(auVar46);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar73 = vpmovsxbd_avx2(auVar40);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar25 + 6);
  auVar65 = vpmovsxbd_avx2(auVar36);
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar29 = (ulong)(uint)((int)(uVar25 * 9) * 2);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar66 = vpmovsxbd_avx2(auVar35);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar29 + uVar25 + 6);
  auVar56 = vpmovsxbd_avx2(auVar37);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vcvtdq2ps_avx(auVar56);
  uVar26 = (ulong)(uint)((int)(uVar25 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar26 + 6);
  auVar68 = vpmovsxbd_avx2(auVar38);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar121._4_4_ = fVar106;
  auVar121._0_4_ = fVar106;
  auVar121._8_4_ = fVar106;
  auVar121._12_4_ = fVar106;
  auVar121._16_4_ = fVar106;
  auVar121._20_4_ = fVar106;
  auVar121._24_4_ = fVar106;
  auVar121._28_4_ = fVar106;
  auVar52 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar57 = ZEXT1632(CONCAT412(fVar201 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar201 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar201 * (ray->dir).field_0.m128[1],fVar106))));
  auVar53 = vpermps_avx512vl(auVar52,auVar57);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar237 = ZEXT3264(auVar54);
  auVar55 = vpermps_avx512vl(auVar54,auVar57);
  fVar106 = auVar55._0_4_;
  auVar232._0_4_ = fVar106 * auVar64._0_4_;
  fVar194 = auVar55._4_4_;
  auVar232._4_4_ = fVar194 * auVar64._4_4_;
  fVar196 = auVar55._8_4_;
  auVar232._8_4_ = fVar196 * auVar64._8_4_;
  fVar198 = auVar55._12_4_;
  auVar232._12_4_ = fVar198 * auVar64._12_4_;
  fVar199 = auVar55._16_4_;
  auVar232._16_4_ = fVar199 * auVar64._16_4_;
  fVar200 = auVar55._20_4_;
  auVar232._20_4_ = fVar200 * auVar64._20_4_;
  fVar96 = auVar55._24_4_;
  auVar232._28_36_ = in_ZMM4._28_36_;
  auVar232._24_4_ = fVar96 * auVar64._24_4_;
  auVar57._4_4_ = auVar65._4_4_ * fVar194;
  auVar57._0_4_ = auVar65._0_4_ * fVar106;
  auVar57._8_4_ = auVar65._8_4_ * fVar196;
  auVar57._12_4_ = auVar65._12_4_ * fVar198;
  auVar57._16_4_ = auVar65._16_4_ * fVar199;
  auVar57._20_4_ = auVar65._20_4_ * fVar200;
  auVar57._24_4_ = auVar65._24_4_ * fVar96;
  auVar57._28_4_ = auVar56._28_4_;
  auVar56._4_4_ = auVar68._4_4_ * fVar194;
  auVar56._0_4_ = auVar68._0_4_ * fVar106;
  auVar56._8_4_ = auVar68._8_4_ * fVar196;
  auVar56._12_4_ = auVar68._12_4_ * fVar198;
  auVar56._16_4_ = auVar68._16_4_ * fVar199;
  auVar56._20_4_ = auVar68._20_4_ * fVar200;
  auVar56._24_4_ = auVar68._24_4_ * fVar96;
  auVar56._28_4_ = auVar55._28_4_;
  auVar34 = vfmadd231ps_fma(auVar232._0_32_,auVar53,auVar58);
  auVar44 = vfmadd231ps_fma(auVar57,auVar53,auVar73);
  auVar45 = vfmadd231ps_fma(auVar56,auVar67,auVar53);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar121,auVar59);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar121,auVar72);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar66,auVar121);
  auVar129._4_4_ = fVar114;
  auVar129._0_4_ = fVar114;
  auVar129._8_4_ = fVar114;
  auVar129._12_4_ = fVar114;
  auVar129._16_4_ = fVar114;
  auVar129._20_4_ = fVar114;
  auVar129._24_4_ = fVar114;
  auVar129._28_4_ = fVar114;
  auVar57 = ZEXT1632(CONCAT412(fVar201 * auVar39._12_4_,
                               CONCAT48(fVar201 * auVar39._8_4_,
                                        CONCAT44(fVar201 * auVar39._4_4_,fVar114))));
  auVar56 = vpermps_avx512vl(auVar52,auVar57);
  auVar57 = vpermps_avx512vl(auVar54,auVar57);
  fVar201 = auVar57._0_4_;
  fVar106 = auVar57._4_4_;
  auVar52._4_4_ = fVar106 * auVar64._4_4_;
  auVar52._0_4_ = fVar201 * auVar64._0_4_;
  fVar194 = auVar57._8_4_;
  auVar52._8_4_ = fVar194 * auVar64._8_4_;
  fVar196 = auVar57._12_4_;
  auVar52._12_4_ = fVar196 * auVar64._12_4_;
  fVar198 = auVar57._16_4_;
  auVar52._16_4_ = fVar198 * auVar64._16_4_;
  fVar199 = auVar57._20_4_;
  auVar52._20_4_ = fVar199 * auVar64._20_4_;
  fVar200 = auVar57._24_4_;
  auVar52._24_4_ = fVar200 * auVar64._24_4_;
  auVar52._28_4_ = auVar64._28_4_;
  auVar70._0_4_ = auVar65._0_4_ * fVar201;
  auVar70._4_4_ = auVar65._4_4_ * fVar106;
  auVar70._8_4_ = auVar65._8_4_ * fVar194;
  auVar70._12_4_ = auVar65._12_4_ * fVar196;
  auVar70._16_4_ = auVar65._16_4_ * fVar198;
  auVar70._20_4_ = auVar65._20_4_ * fVar199;
  auVar70._24_4_ = auVar65._24_4_ * fVar200;
  auVar70._28_4_ = 0;
  auVar65._4_4_ = auVar68._4_4_ * fVar106;
  auVar65._0_4_ = auVar68._0_4_ * fVar201;
  auVar65._8_4_ = auVar68._8_4_ * fVar194;
  auVar65._12_4_ = auVar68._12_4_ * fVar196;
  auVar65._16_4_ = auVar68._16_4_ * fVar198;
  auVar65._20_4_ = auVar68._20_4_ * fVar199;
  auVar65._24_4_ = auVar68._24_4_ * fVar200;
  auVar65._28_4_ = auVar57._28_4_;
  auVar46 = vfmadd231ps_fma(auVar52,auVar56,auVar58);
  auVar40 = vfmadd231ps_fma(auVar70,auVar56,auVar73);
  auVar36 = vfmadd231ps_fma(auVar65,auVar56,auVar67);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar129,auVar59);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar129,auVar72);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar129,auVar66);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar74._16_4_ = 0x7fffffff;
  auVar74._20_4_ = 0x7fffffff;
  auVar74._24_4_ = 0x7fffffff;
  auVar74._28_4_ = 0x7fffffff;
  auVar59 = vandps_avx(ZEXT1632(auVar34),auVar74);
  auVar76._8_4_ = 0x219392ef;
  auVar76._0_8_ = 0x219392ef219392ef;
  auVar76._12_4_ = 0x219392ef;
  auVar76._16_4_ = 0x219392ef;
  auVar76._20_4_ = 0x219392ef;
  auVar76._24_4_ = 0x219392ef;
  auVar76._28_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar59,auVar76,1);
  bVar33 = (bool)((byte)uVar29 & 1);
  auVar53._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar34._0_4_;
  bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar34._4_4_;
  bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar34._8_4_;
  bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar53._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar34._12_4_;
  auVar53._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar53._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar53._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar53._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar59 = vandps_avx(ZEXT1632(auVar44),auVar74);
  uVar29 = vcmpps_avx512vl(auVar59,auVar76,1);
  bVar33 = (bool)((byte)uVar29 & 1);
  auVar54._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._0_4_;
  bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar54._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._4_4_;
  bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar54._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._8_4_;
  bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar54._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._12_4_;
  auVar54._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar54._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar54._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar54._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar59 = vandps_avx(ZEXT1632(auVar45),auVar74);
  uVar29 = vcmpps_avx512vl(auVar59,auVar76,1);
  bVar33 = (bool)((byte)uVar29 & 1);
  auVar59._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar45._0_4_;
  bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar45._4_4_;
  bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar45._8_4_;
  bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar45._12_4_;
  auVar59._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar59._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar59._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar59._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar58 = vrcp14ps_avx512vl(auVar53);
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = &DAT_3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar75._16_4_ = 0x3f800000;
  auVar75._20_4_ = 0x3f800000;
  auVar75._24_4_ = 0x3f800000;
  auVar75._28_4_ = 0x3f800000;
  auVar34 = vfnmadd213ps_fma(auVar53,auVar58,auVar75);
  auVar34 = vfmadd132ps_fma(ZEXT1632(auVar34),auVar58,auVar58);
  auVar58 = vrcp14ps_avx512vl(auVar54);
  auVar44 = vfnmadd213ps_fma(auVar54,auVar58,auVar75);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar58,auVar58);
  auVar58 = vrcp14ps_avx512vl(auVar59);
  auVar45 = vfnmadd213ps_fma(auVar59,auVar58,auVar75);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar58,auVar58);
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 7 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar46));
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 9 + 6));
  auVar66._4_4_ = auVar34._4_4_ * auVar59._4_4_;
  auVar66._0_4_ = auVar34._0_4_ * auVar59._0_4_;
  auVar66._8_4_ = auVar34._8_4_ * auVar59._8_4_;
  auVar66._12_4_ = auVar34._12_4_ * auVar59._12_4_;
  auVar66._16_4_ = auVar59._16_4_ * 0.0;
  auVar66._20_4_ = auVar59._20_4_ * 0.0;
  auVar66._24_4_ = auVar59._24_4_ * 0.0;
  auVar66._28_4_ = auVar59._28_4_;
  auVar59 = vcvtdq2ps_avx(auVar58);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar46));
  auVar71._0_4_ = auVar34._0_4_ * auVar59._0_4_;
  auVar71._4_4_ = auVar34._4_4_ * auVar59._4_4_;
  auVar71._8_4_ = auVar34._8_4_ * auVar59._8_4_;
  auVar71._12_4_ = auVar34._12_4_ * auVar59._12_4_;
  auVar71._16_4_ = auVar59._16_4_ * 0.0;
  auVar71._20_4_ = auVar59._20_4_ * 0.0;
  auVar71._24_4_ = auVar59._24_4_ * 0.0;
  auVar71._28_4_ = 0;
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar25 * -2 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar40));
  auVar67._4_4_ = auVar44._4_4_ * auVar59._4_4_;
  auVar67._0_4_ = auVar44._0_4_ * auVar59._0_4_;
  auVar67._8_4_ = auVar44._8_4_ * auVar59._8_4_;
  auVar67._12_4_ = auVar44._12_4_ * auVar59._12_4_;
  auVar67._16_4_ = auVar59._16_4_ * 0.0;
  auVar67._20_4_ = auVar59._20_4_ * 0.0;
  auVar67._24_4_ = auVar59._24_4_ * 0.0;
  auVar67._28_4_ = auVar59._28_4_;
  auVar59 = vcvtdq2ps_avx(auVar58);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar40));
  auVar69._0_4_ = auVar44._0_4_ * auVar59._0_4_;
  auVar69._4_4_ = auVar44._4_4_ * auVar59._4_4_;
  auVar69._8_4_ = auVar44._8_4_ * auVar59._8_4_;
  auVar69._12_4_ = auVar44._12_4_ * auVar59._12_4_;
  auVar69._16_4_ = auVar59._16_4_ * 0.0;
  auVar69._20_4_ = auVar59._20_4_ * 0.0;
  auVar69._24_4_ = auVar59._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 + uVar25 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar36));
  auVar68._4_4_ = auVar59._4_4_ * auVar45._4_4_;
  auVar68._0_4_ = auVar59._0_4_ * auVar45._0_4_;
  auVar68._8_4_ = auVar59._8_4_ * auVar45._8_4_;
  auVar68._12_4_ = auVar59._12_4_ * auVar45._12_4_;
  auVar68._16_4_ = auVar59._16_4_ * 0.0;
  auVar68._20_4_ = auVar59._20_4_ * 0.0;
  auVar68._24_4_ = auVar59._24_4_ * 0.0;
  auVar68._28_4_ = auVar59._28_4_;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 0x17 + 6));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,ZEXT1632(auVar36));
  auVar55._0_4_ = auVar45._0_4_ * auVar59._0_4_;
  auVar55._4_4_ = auVar45._4_4_ * auVar59._4_4_;
  auVar55._8_4_ = auVar45._8_4_ * auVar59._8_4_;
  auVar55._12_4_ = auVar45._12_4_ * auVar59._12_4_;
  auVar55._16_4_ = auVar59._16_4_ * 0.0;
  auVar55._20_4_ = auVar59._20_4_ * 0.0;
  auVar55._24_4_ = auVar59._24_4_ * 0.0;
  auVar55._28_4_ = 0;
  auVar59 = vpminsd_avx2(auVar66,auVar71);
  auVar58 = vpminsd_avx2(auVar67,auVar69);
  auVar59 = vmaxps_avx(auVar59,auVar58);
  auVar58 = vpminsd_avx2(auVar68,auVar55);
  uVar91 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar64._4_4_ = uVar91;
  auVar64._0_4_ = uVar91;
  auVar64._8_4_ = uVar91;
  auVar64._12_4_ = uVar91;
  auVar64._16_4_ = uVar91;
  auVar64._20_4_ = uVar91;
  auVar64._24_4_ = uVar91;
  auVar64._28_4_ = uVar91;
  auVar58 = vmaxps_avx512vl(auVar58,auVar64);
  auVar59 = vmaxps_avx(auVar59,auVar58);
  auVar58._8_4_ = 0x3f7ffffa;
  auVar58._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar58._12_4_ = 0x3f7ffffa;
  auVar58._16_4_ = 0x3f7ffffa;
  auVar58._20_4_ = 0x3f7ffffa;
  auVar58._24_4_ = 0x3f7ffffa;
  auVar58._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar59,auVar58);
  auVar59 = vpmaxsd_avx2(auVar66,auVar71);
  auVar58 = vpmaxsd_avx2(auVar67,auVar69);
  auVar59 = vminps_avx(auVar59,auVar58);
  auVar58 = vpmaxsd_avx2(auVar68,auVar55);
  fVar201 = ray->tfar;
  auVar72._4_4_ = fVar201;
  auVar72._0_4_ = fVar201;
  auVar72._8_4_ = fVar201;
  auVar72._12_4_ = fVar201;
  auVar72._16_4_ = fVar201;
  auVar72._20_4_ = fVar201;
  auVar72._24_4_ = fVar201;
  auVar72._28_4_ = fVar201;
  auVar58 = vminps_avx512vl(auVar58,auVar72);
  auVar59 = vminps_avx(auVar59,auVar58);
  auVar73._8_4_ = 0x3f800003;
  auVar73._0_8_ = 0x3f8000033f800003;
  auVar73._12_4_ = 0x3f800003;
  auVar73._16_4_ = 0x3f800003;
  auVar73._20_4_ = 0x3f800003;
  auVar73._24_4_ = 0x3f800003;
  auVar73._28_4_ = 0x3f800003;
  auVar59 = vmulps_avx512vl(auVar59,auVar73);
  auVar58 = vpbroadcastd_avx512vl();
  uVar13 = vpcmpgtd_avx512vl(auVar58,_DAT_0205a920);
  uVar11 = vcmpps_avx512vl(local_b8,auVar59,2);
  bVar32 = (byte)((byte)uVar11 & (byte)uVar13) == 0;
  bVar33 = !bVar32;
  if (bVar32) {
    return bVar33;
  }
  local_2d0 = (ulong)(byte)((byte)uVar11 & (byte)uVar13);
  auVar89._16_16_ = auVar58._16_16_;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar34);
  auVar89._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar89._0_16_);
  local_330 = prim;
LAB_01d9606c:
  lVar30 = 0;
  for (uVar29 = local_2d0; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar31 = *(uint *)(local_330 + 2);
  local_2d8 = (ulong)*(uint *)(local_330 + lVar30 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar31].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_2d8 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar34 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar29);
  lVar30 = uVar29 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar30);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar45 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar29);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar30);
  auVar61._16_16_ = auVar89._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar36 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar29),
                       auVar34,auVar35);
  auVar37 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar30),
                       auVar44,auVar35);
  auVar38 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar29 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar45,auVar35);
  auVar39 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar30),
                       auVar46,auVar35);
  auVar61._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar40 = vmulps_avx512vl(auVar44,auVar61._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar40,auVar37,auVar61._0_16_);
  auVar40 = vfmadd213ps_fma((undefined1  [16])0x0,auVar36,auVar41);
  auVar49._0_4_ = auVar34._0_4_ + auVar40._0_4_;
  auVar49._4_4_ = auVar34._4_4_ + auVar40._4_4_;
  auVar49._8_4_ = auVar34._8_4_ + auVar40._8_4_;
  auVar49._12_4_ = auVar34._12_4_ + auVar40._12_4_;
  auVar51 = auVar241._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar51);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar34,auVar51);
  auVar40 = vmulps_avx512vl(auVar46,auVar61._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar40,auVar39,auVar61._0_16_);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar42);
  auVar211._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar211._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar211._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar211._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar38,auVar51);
  auVar42 = vfnmadd231ps_avx512vl(auVar40,auVar45,auVar51);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar37,auVar44);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar61._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar40,auVar34,auVar61._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar51);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar51,auVar37);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar61._0_16_,auVar36);
  auVar37 = vfnmadd231ps_avx512vl(auVar44,auVar61._0_16_,auVar34);
  auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar46);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar38,auVar61._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar34,auVar45,auVar61._0_16_);
  auVar34 = vmulps_avx512vl(auVar46,auVar51);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar51,auVar39);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar61._0_16_,auVar38);
  auVar36 = vfnmadd231ps_avx512vl(auVar34,auVar61._0_16_,auVar45);
  auVar34 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar44 = vshufps_avx(auVar211,auVar211,0xc9);
  fVar114 = auVar41._0_4_;
  auVar140._0_4_ = fVar114 * auVar44._0_4_;
  fVar93 = auVar41._4_4_;
  auVar140._4_4_ = fVar93 * auVar44._4_4_;
  fVar94 = auVar41._8_4_;
  auVar140._8_4_ = fVar94 * auVar44._8_4_;
  fVar95 = auVar41._12_4_;
  auVar140._12_4_ = fVar95 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar140,auVar34,auVar211);
  auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar161._0_4_ = auVar44._0_4_ * fVar114;
  auVar161._4_4_ = auVar44._4_4_ * fVar93;
  auVar161._8_4_ = auVar44._8_4_ * fVar94;
  auVar161._12_4_ = auVar44._12_4_ * fVar95;
  auVar34 = vfmsub231ps_fma(auVar161,auVar34,auVar42);
  auVar46 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar44 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar201 = auVar37._0_4_;
  auVar172._0_4_ = auVar44._0_4_ * fVar201;
  fVar106 = auVar37._4_4_;
  auVar172._4_4_ = auVar44._4_4_ * fVar106;
  fVar194 = auVar37._8_4_;
  auVar172._8_4_ = auVar44._8_4_ * fVar194;
  fVar196 = auVar37._12_4_;
  auVar172._12_4_ = auVar44._12_4_ * fVar196;
  auVar44 = vfmsub231ps_fma(auVar172,auVar34,auVar40);
  auVar40 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar173._0_4_ = auVar44._0_4_ * fVar201;
  auVar173._4_4_ = auVar44._4_4_ * fVar106;
  auVar173._8_4_ = auVar44._8_4_ * fVar194;
  auVar173._12_4_ = auVar44._12_4_ * fVar196;
  auVar34 = vfmsub231ps_fma(auVar173,auVar34,auVar36);
  auVar36 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar198 = auVar34._0_4_;
  auVar60._4_28_ = auVar61._4_28_;
  auVar60._0_4_ = fVar198;
  auVar44 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar60._0_16_);
  fVar199 = auVar44._0_4_;
  fVar200 = fVar199 * 1.5 - fVar198 * 0.5 * fVar199 * fVar199 * fVar199;
  auVar44 = vdpps_avx(auVar45,auVar46,0x7f);
  fVar210 = fVar200 * auVar45._0_4_;
  fVar217 = fVar200 * auVar45._4_4_;
  fVar218 = fVar200 * auVar45._8_4_;
  fVar219 = fVar200 * auVar45._12_4_;
  auVar162._0_4_ = fVar198 * auVar46._0_4_;
  auVar162._4_4_ = fVar198 * auVar46._4_4_;
  auVar162._8_4_ = fVar198 * auVar46._8_4_;
  auVar162._12_4_ = fVar198 * auVar46._12_4_;
  fVar198 = auVar44._0_4_;
  auVar141._0_4_ = fVar198 * auVar45._0_4_;
  auVar141._4_4_ = fVar198 * auVar45._4_4_;
  auVar141._8_4_ = fVar198 * auVar45._8_4_;
  auVar141._12_4_ = fVar198 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar162,auVar141);
  auVar44 = vrcp14ss_avx512f(auVar61._0_16_,auVar60._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar44,ZEXT416(0x40000000));
  fVar198 = auVar44._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar40,auVar40,0x7f);
  fVar199 = auVar34._0_4_;
  auVar63._16_16_ = auVar61._16_16_;
  auVar63._0_16_ = auVar61._0_16_;
  auVar62._4_28_ = auVar63._4_28_;
  auVar62._0_4_ = fVar199;
  auVar44 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar62._0_16_);
  fVar96 = auVar44._0_4_;
  fVar96 = fVar96 * 1.5 - fVar199 * 0.5 * fVar96 * fVar96 * fVar96;
  fVar182 = fVar96 * auVar40._0_4_;
  fVar193 = fVar96 * auVar40._4_4_;
  fVar195 = fVar96 * auVar40._8_4_;
  fVar197 = fVar96 * auVar40._12_4_;
  auVar44 = vdpps_avx(auVar40,auVar36,0x7f);
  auVar131._0_4_ = fVar199 * auVar36._0_4_;
  auVar131._4_4_ = fVar199 * auVar36._4_4_;
  auVar131._8_4_ = fVar199 * auVar36._8_4_;
  auVar131._12_4_ = fVar199 * auVar36._12_4_;
  fVar199 = auVar44._0_4_;
  auVar50._0_4_ = fVar199 * auVar40._0_4_;
  auVar50._4_4_ = fVar199 * auVar40._4_4_;
  auVar50._8_4_ = fVar199 * auVar40._8_4_;
  auVar50._12_4_ = fVar199 * auVar40._12_4_;
  auVar46 = vsubps_avx(auVar131,auVar50);
  auVar44 = vrcp14ss_avx512f(auVar61._0_16_,auVar62._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar44,ZEXT416(0x40000000));
  fVar199 = auVar44._0_4_ * auVar34._0_4_;
  auVar34 = vshufps_avx(auVar49,auVar49,0xff);
  auVar149._0_4_ = fVar210 * auVar34._0_4_;
  auVar149._4_4_ = fVar217 * auVar34._4_4_;
  auVar149._8_4_ = fVar218 * auVar34._8_4_;
  auVar149._12_4_ = fVar219 * auVar34._12_4_;
  local_218 = vsubps_avx(auVar49,auVar149);
  auVar44 = vshufps_avx(auVar41,auVar41,0xff);
  auVar132._0_4_ = auVar44._0_4_ * fVar210 + auVar34._0_4_ * fVar200 * fVar198 * auVar45._0_4_;
  auVar132._4_4_ = auVar44._4_4_ * fVar217 + auVar34._4_4_ * fVar200 * fVar198 * auVar45._4_4_;
  auVar132._8_4_ = auVar44._8_4_ * fVar218 + auVar34._8_4_ * fVar200 * fVar198 * auVar45._8_4_;
  auVar132._12_4_ = auVar44._12_4_ * fVar219 + auVar34._12_4_ * fVar200 * fVar198 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar41,auVar132);
  local_228._0_4_ = auVar49._0_4_ + auVar149._0_4_;
  local_228._4_4_ = auVar49._4_4_ + auVar149._4_4_;
  fStack_220 = auVar49._8_4_ + auVar149._8_4_;
  fStack_21c = auVar49._12_4_ + auVar149._12_4_;
  auVar39._0_4_ = fVar114 + auVar132._0_4_;
  auVar39._4_4_ = fVar93 + auVar132._4_4_;
  auVar39._8_4_ = fVar94 + auVar132._8_4_;
  auVar39._12_4_ = fVar95 + auVar132._12_4_;
  auVar34 = vshufps_avx(auVar43,auVar43,0xff);
  auVar133._0_4_ = fVar182 * auVar34._0_4_;
  auVar133._4_4_ = fVar193 * auVar34._4_4_;
  auVar133._8_4_ = fVar195 * auVar34._8_4_;
  auVar133._12_4_ = fVar197 * auVar34._12_4_;
  local_238 = vsubps_avx(auVar43,auVar133);
  auVar44 = vshufps_avx(auVar37,auVar37,0xff);
  auVar42._0_4_ = fVar182 * auVar44._0_4_ + auVar34._0_4_ * fVar96 * auVar46._0_4_ * fVar199;
  auVar42._4_4_ = fVar193 * auVar44._4_4_ + auVar34._4_4_ * fVar96 * auVar46._4_4_ * fVar199;
  auVar42._8_4_ = fVar195 * auVar44._8_4_ + auVar34._8_4_ * fVar96 * auVar46._8_4_ * fVar199;
  auVar42._12_4_ = fVar197 * auVar44._12_4_ + auVar34._12_4_ * fVar96 * auVar46._12_4_ * fVar199;
  auVar34 = vsubps_avx(auVar37,auVar42);
  _local_248 = vaddps_avx512vl(auVar43,auVar133);
  auVar43._0_4_ = fVar201 + auVar42._0_4_;
  auVar43._4_4_ = fVar106 + auVar42._4_4_;
  auVar43._8_4_ = fVar194 + auVar42._8_4_;
  auVar43._12_4_ = fVar196 + auVar42._12_4_;
  auVar44 = vmulps_avx512vl(auVar45,auVar35);
  local_258 = vaddps_avx512vl(local_218,auVar44);
  auVar34 = vmulps_avx512vl(auVar34,auVar35);
  local_268 = vsubps_avx512vl(local_238,auVar34);
  auVar34 = vmulps_avx512vl(auVar39,auVar35);
  _local_278 = vaddps_avx512vl(_local_228,auVar34);
  auVar34 = vmulps_avx512vl(auVar43,auVar35);
  _local_288 = vsubps_avx512vl(_local_248,auVar34);
  aVar1 = (ray->org).field_0;
  auVar44 = vsubps_avx(local_218,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar51._4_4_ = uVar91;
  auVar51._0_4_ = uVar91;
  auVar51._8_4_ = uVar91;
  auVar51._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar201 = (pre->ray_space).vz.field_0.m128[0];
  fVar106 = (pre->ray_space).vz.field_0.m128[1];
  fVar194 = (pre->ray_space).vz.field_0.m128[2];
  fVar196 = (pre->ray_space).vz.field_0.m128[3];
  auVar41._0_4_ = fVar201 * auVar44._0_4_;
  auVar41._4_4_ = fVar106 * auVar44._4_4_;
  auVar41._8_4_ = fVar194 * auVar44._8_4_;
  auVar41._12_4_ = fVar196 * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar34);
  auVar40 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar51);
  auVar44 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar47._4_4_ = uVar91;
  auVar47._0_4_ = uVar91;
  auVar47._8_4_ = uVar91;
  auVar47._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar97._0_4_ = fVar201 * auVar44._0_4_;
  auVar97._4_4_ = fVar106 * auVar44._4_4_;
  auVar97._8_4_ = fVar194 * auVar44._8_4_;
  auVar97._12_4_ = fVar196 * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar3,auVar34);
  auVar36 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar47);
  auVar44 = vsubps_avx512vl(local_268,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar142._4_4_ = uVar91;
  auVar142._0_4_ = uVar91;
  auVar142._8_4_ = uVar91;
  auVar142._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar48._0_4_ = fVar201 * auVar44._0_4_;
  auVar48._4_4_ = fVar106 * auVar44._4_4_;
  auVar48._8_4_ = fVar194 * auVar44._8_4_;
  auVar48._12_4_ = fVar196 * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar3,auVar34);
  auVar35 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar142);
  auVar44 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar163._4_4_ = uVar91;
  auVar163._0_4_ = uVar91;
  auVar163._8_4_ = uVar91;
  auVar163._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar143._0_4_ = fVar201 * auVar44._0_4_;
  auVar143._4_4_ = fVar106 * auVar44._4_4_;
  auVar143._8_4_ = fVar194 * auVar44._8_4_;
  auVar143._12_4_ = fVar196 * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar3,auVar34);
  auVar37 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar163);
  auVar44 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar174._4_4_ = uVar91;
  auVar174._0_4_ = uVar91;
  auVar174._8_4_ = uVar91;
  auVar174._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar164._0_4_ = auVar44._0_4_ * fVar201;
  auVar164._4_4_ = auVar44._4_4_ * fVar106;
  auVar164._8_4_ = auVar44._8_4_ * fVar194;
  auVar164._12_4_ = auVar44._12_4_ * fVar196;
  auVar34 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar34);
  auVar38 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar174);
  auVar44 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar183._4_4_ = uVar91;
  auVar183._0_4_ = uVar91;
  auVar183._8_4_ = uVar91;
  auVar183._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar175._0_4_ = auVar44._0_4_ * fVar201;
  auVar175._4_4_ = auVar44._4_4_ * fVar106;
  auVar175._8_4_ = auVar44._8_4_ * fVar194;
  auVar175._12_4_ = auVar44._12_4_ * fVar196;
  auVar34 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar34);
  auVar39 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar183);
  auVar44 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar202._4_4_ = uVar91;
  auVar202._0_4_ = uVar91;
  auVar202._8_4_ = uVar91;
  auVar202._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar184._0_4_ = auVar44._0_4_ * fVar201;
  auVar184._4_4_ = auVar44._4_4_ * fVar106;
  auVar184._8_4_ = auVar44._8_4_ * fVar194;
  auVar184._12_4_ = auVar44._12_4_ * fVar196;
  auVar34 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar3,auVar34);
  auVar41 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar202);
  auVar44 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
  uVar91 = auVar44._0_4_;
  auVar203._4_4_ = uVar91;
  auVar203._0_4_ = uVar91;
  auVar203._8_4_ = uVar91;
  auVar203._12_4_ = uVar91;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar124._0_4_ = fVar201 * auVar44._0_4_;
  auVar124._4_4_ = fVar106 * auVar44._4_4_;
  auVar124._8_4_ = fVar194 * auVar44._8_4_;
  auVar124._12_4_ = fVar196 * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar3,auVar34);
  auVar42 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar203);
  local_358 = vmovlhps_avx512f(auVar40,auVar38);
  auVar239 = ZEXT1664(local_358);
  local_2f8 = vmovlhps_avx(auVar36,auVar39);
  local_308 = vmovlhps_avx512f(auVar35,auVar41);
  _local_1f8 = vmovlhps_avx512f(auVar37,auVar42);
  auVar34 = vminps_avx512vl(local_358,local_2f8);
  auVar45 = vmaxps_avx512vl(local_358,local_2f8);
  auVar44 = vminps_avx512vl(local_308,_local_1f8);
  auVar44 = vminps_avx(auVar34,auVar44);
  auVar34 = vmaxps_avx512vl(local_308,_local_1f8);
  auVar34 = vmaxps_avx(auVar45,auVar34);
  auVar45 = vshufpd_avx(auVar44,auVar44,3);
  auVar46 = vshufpd_avx(auVar34,auVar34,3);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar34 = vmaxps_avx(auVar34,auVar46);
  auVar44 = vandps_avx512vl(auVar44,auVar232._0_16_);
  auVar34 = vandps_avx512vl(auVar34,auVar232._0_16_);
  auVar34 = vmaxps_avx(auVar44,auVar34);
  auVar44 = vmovshdup_avx(auVar34);
  auVar34 = vmaxss_avx(auVar44,auVar34);
  local_338 = local_2d0 + 0xff;
  local_178._8_8_ = auVar40._0_8_;
  local_178._0_8_ = auVar40._0_8_;
  local_188._8_8_ = auVar36._0_8_;
  local_188._0_8_ = auVar36._0_8_;
  local_198 = vmovddup_avx512vl(auVar35);
  local_1a8._0_8_ = auVar37._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar38._0_8_;
  local_1b8 = auVar38._0_8_;
  register0x00001408 = auVar39._0_8_;
  local_1c8 = auVar39._0_8_;
  register0x00001448 = auVar41._0_8_;
  local_1d8 = auVar41._0_8_;
  register0x00001488 = auVar42._0_8_;
  local_1e8 = auVar42._0_8_;
  local_208 = ZEXT416((uint)(auVar34._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar34 = vxorps_avx512vl(local_78._0_16_,auVar233._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar34);
  local_318 = vsubps_avx512vl(local_2f8,local_358);
  local_328 = vsubps_avx512vl(local_308,local_2f8);
  local_e8 = vsubps_avx512vl(_local_1f8,local_308);
  local_f8 = vsubps_avx(_local_228,local_218);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  local_118 = vsubps_avx512vl(_local_288,local_268);
  _local_128 = vsubps_avx512vl(_local_248,local_238);
  bVar32 = false;
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar230 = ZEXT1664(auVar34);
  uVar29 = 0;
  do {
    auVar38 = auVar230._0_16_;
    auVar236 = ZEXT1664(auVar38);
    auVar44 = vshufps_avx(auVar38,auVar38,0x50);
    auVar220._8_4_ = 0x3f800000;
    auVar220._0_8_ = &DAT_3f8000003f800000;
    auVar220._12_4_ = 0x3f800000;
    auVar223._16_4_ = 0x3f800000;
    auVar223._0_16_ = auVar220;
    auVar223._20_4_ = 0x3f800000;
    auVar223._24_4_ = 0x3f800000;
    auVar223._28_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar220,auVar44);
    fVar201 = auVar44._0_4_;
    auVar115._0_4_ = local_1b8._0_4_ * fVar201;
    fVar106 = auVar44._4_4_;
    auVar115._4_4_ = local_1b8._4_4_ * fVar106;
    fVar194 = auVar44._8_4_;
    auVar115._8_4_ = local_1b8._8_4_ * fVar194;
    fVar196 = auVar44._12_4_;
    auVar115._12_4_ = local_1b8._12_4_ * fVar196;
    auVar125._0_4_ = local_1c8._0_4_ * fVar201;
    auVar125._4_4_ = local_1c8._4_4_ * fVar106;
    auVar125._8_4_ = local_1c8._8_4_ * fVar194;
    auVar125._12_4_ = local_1c8._12_4_ * fVar196;
    auVar134._0_4_ = local_1d8._0_4_ * fVar201;
    auVar134._4_4_ = local_1d8._4_4_ * fVar106;
    auVar134._8_4_ = local_1d8._8_4_ * fVar194;
    auVar134._12_4_ = local_1d8._12_4_ * fVar196;
    auVar98._0_4_ = local_1e8._0_4_ * fVar201;
    auVar98._4_4_ = local_1e8._4_4_ * fVar106;
    auVar98._8_4_ = local_1e8._8_4_ * fVar194;
    auVar98._12_4_ = local_1e8._12_4_ * fVar196;
    auVar46 = vfmadd231ps_fma(auVar115,auVar45,local_178);
    auVar40 = vfmadd231ps_fma(auVar125,auVar45,local_188);
    auVar36 = vfmadd231ps_avx512vl(auVar134,auVar45,local_198);
    auVar45 = vfmadd231ps_fma(auVar98,local_1a8,auVar45);
    auVar44 = vmovshdup_avx(auVar34);
    fVar106 = auVar34._0_4_;
    fVar201 = (auVar44._0_4_ - fVar106) * 0.04761905;
    auVar160._4_4_ = fVar106;
    auVar160._0_4_ = fVar106;
    auVar160._8_4_ = fVar106;
    auVar160._12_4_ = fVar106;
    auVar160._16_4_ = fVar106;
    auVar160._20_4_ = fVar106;
    auVar160._24_4_ = fVar106;
    auVar160._28_4_ = fVar106;
    auVar111._0_8_ = auVar44._0_8_;
    auVar111._8_8_ = auVar111._0_8_;
    auVar111._16_8_ = auVar111._0_8_;
    auVar111._24_8_ = auVar111._0_8_;
    auVar59 = vsubps_avx(auVar111,auVar160);
    uVar91 = auVar46._0_4_;
    auVar112._4_4_ = uVar91;
    auVar112._0_4_ = uVar91;
    auVar112._8_4_ = uVar91;
    auVar112._12_4_ = uVar91;
    auVar112._16_4_ = uVar91;
    auVar112._20_4_ = uVar91;
    auVar112._24_4_ = uVar91;
    auVar112._28_4_ = uVar91;
    auVar179._8_4_ = 1;
    auVar179._0_8_ = 0x100000001;
    auVar179._12_4_ = 1;
    auVar179._16_4_ = 1;
    auVar179._20_4_ = 1;
    auVar179._24_4_ = 1;
    auVar179._28_4_ = 1;
    auVar72 = ZEXT1632(auVar46);
    auVar58 = vpermps_avx2(auVar179,auVar72);
    auVar64 = vbroadcastss_avx512vl(auVar40);
    auVar73 = ZEXT1632(auVar40);
    auVar65 = vpermps_avx512vl(auVar179,auVar73);
    auVar66 = vbroadcastss_avx512vl(auVar36);
    auVar55 = ZEXT1632(auVar36);
    auVar67 = vpermps_avx512vl(auVar179,auVar55);
    auVar68 = vbroadcastss_avx512vl(auVar45);
    auVar69 = ZEXT1632(auVar45);
    auVar56 = vpermps_avx512vl(auVar179,auVar69);
    auVar180._4_4_ = fVar201;
    auVar180._0_4_ = fVar201;
    auVar180._8_4_ = fVar201;
    auVar180._12_4_ = fVar201;
    auVar180._16_4_ = fVar201;
    auVar180._20_4_ = fVar201;
    auVar180._24_4_ = fVar201;
    auVar180._28_4_ = fVar201;
    auVar70 = auVar237._0_32_;
    auVar57 = vpermps_avx512vl(auVar70,auVar72);
    auVar147._8_4_ = 3;
    auVar147._0_8_ = 0x300000003;
    auVar147._12_4_ = 3;
    auVar147._16_4_ = 3;
    auVar147._20_4_ = 3;
    auVar147._24_4_ = 3;
    auVar147._28_4_ = 3;
    auVar52 = vpermps_avx512vl(auVar147,auVar72);
    auVar53 = vpermps_avx512vl(auVar70,auVar73);
    auVar72 = vpermps_avx2(auVar147,auVar73);
    auVar54 = vpermps_avx512vl(auVar70,auVar55);
    auVar73 = vpermps_avx2(auVar147,auVar55);
    auVar55 = vpermps_avx512vl(auVar70,auVar69);
    auVar69 = vpermps_avx512vl(auVar147,auVar69);
    auVar44 = vfmadd132ps_fma(auVar59,auVar160,_DAT_02020f20);
    auVar59 = vsubps_avx(auVar223,ZEXT1632(auVar44));
    auVar70 = vmulps_avx512vl(auVar64,ZEXT1632(auVar44));
    auVar74 = ZEXT1632(auVar44);
    auVar71 = vmulps_avx512vl(auVar65,auVar74);
    auVar45 = vfmadd231ps_fma(auVar70,auVar59,auVar112);
    auVar46 = vfmadd231ps_fma(auVar71,auVar59,auVar58);
    auVar70 = vmulps_avx512vl(auVar66,auVar74);
    auVar71 = vmulps_avx512vl(auVar67,auVar74);
    auVar64 = vfmadd231ps_avx512vl(auVar70,auVar59,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar71,auVar59,auVar65);
    auVar70 = vmulps_avx512vl(auVar68,auVar74);
    auVar71 = ZEXT1632(auVar44);
    auVar56 = vmulps_avx512vl(auVar56,auVar71);
    auVar66 = vfmadd231ps_avx512vl(auVar70,auVar59,auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar67);
    fVar194 = auVar44._0_4_;
    fVar196 = auVar44._4_4_;
    auVar16._4_4_ = fVar196 * auVar64._4_4_;
    auVar16._0_4_ = fVar194 * auVar64._0_4_;
    fVar198 = auVar44._8_4_;
    auVar16._8_4_ = fVar198 * auVar64._8_4_;
    fVar199 = auVar44._12_4_;
    auVar16._12_4_ = fVar199 * auVar64._12_4_;
    auVar16._16_4_ = auVar64._16_4_ * 0.0;
    auVar16._20_4_ = auVar64._20_4_ * 0.0;
    auVar16._24_4_ = auVar64._24_4_ * 0.0;
    auVar16._28_4_ = fVar106;
    auVar17._4_4_ = fVar196 * auVar65._4_4_;
    auVar17._0_4_ = fVar194 * auVar65._0_4_;
    auVar17._8_4_ = fVar198 * auVar65._8_4_;
    auVar17._12_4_ = fVar199 * auVar65._12_4_;
    auVar17._16_4_ = auVar65._16_4_ * 0.0;
    auVar17._20_4_ = auVar65._20_4_ * 0.0;
    auVar17._24_4_ = auVar65._24_4_ * 0.0;
    auVar17._28_4_ = auVar58._28_4_;
    auVar45 = vfmadd231ps_fma(auVar16,auVar59,ZEXT1632(auVar45));
    auVar46 = vfmadd231ps_fma(auVar17,auVar59,ZEXT1632(auVar46));
    auVar104._0_4_ = fVar194 * auVar66._0_4_;
    auVar104._4_4_ = fVar196 * auVar66._4_4_;
    auVar104._8_4_ = fVar198 * auVar66._8_4_;
    auVar104._12_4_ = fVar199 * auVar66._12_4_;
    auVar104._16_4_ = auVar66._16_4_ * 0.0;
    auVar104._20_4_ = auVar66._20_4_ * 0.0;
    auVar104._24_4_ = auVar66._24_4_ * 0.0;
    auVar104._28_4_ = 0;
    auVar18._4_4_ = fVar196 * auVar67._4_4_;
    auVar18._0_4_ = fVar194 * auVar67._0_4_;
    auVar18._8_4_ = fVar198 * auVar67._8_4_;
    auVar18._12_4_ = fVar199 * auVar67._12_4_;
    auVar18._16_4_ = auVar67._16_4_ * 0.0;
    auVar18._20_4_ = auVar67._20_4_ * 0.0;
    auVar18._24_4_ = auVar67._24_4_ * 0.0;
    auVar18._28_4_ = auVar66._28_4_;
    auVar40 = vfmadd231ps_fma(auVar104,auVar59,auVar64);
    auVar36 = vfmadd231ps_fma(auVar18,auVar59,auVar65);
    auVar19._28_4_ = auVar65._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar199 * auVar36._12_4_,
                            CONCAT48(fVar198 * auVar36._8_4_,
                                     CONCAT44(fVar196 * auVar36._4_4_,fVar194 * auVar36._0_4_))));
    auVar35 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar199 * auVar40._12_4_,
                                                 CONCAT48(fVar198 * auVar40._8_4_,
                                                          CONCAT44(fVar196 * auVar40._4_4_,
                                                                   fVar194 * auVar40._0_4_)))),
                              auVar59,ZEXT1632(auVar45));
    auVar37 = vfmadd231ps_fma(auVar19,auVar59,ZEXT1632(auVar46));
    auVar58 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar45));
    auVar64 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar46));
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar58 = vmulps_avx512vl(auVar58,auVar65);
    auVar64 = vmulps_avx512vl(auVar64,auVar65);
    auVar171._0_4_ = fVar201 * auVar58._0_4_;
    auVar171._4_4_ = fVar201 * auVar58._4_4_;
    auVar171._8_4_ = fVar201 * auVar58._8_4_;
    auVar171._12_4_ = fVar201 * auVar58._12_4_;
    auVar171._16_4_ = fVar201 * auVar58._16_4_;
    auVar171._20_4_ = fVar201 * auVar58._20_4_;
    auVar171._24_4_ = fVar201 * auVar58._24_4_;
    auVar171._28_4_ = 0;
    auVar58 = vmulps_avx512vl(auVar180,auVar64);
    auVar40 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar35),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar105._0_4_ = auVar171._0_4_ + auVar35._0_4_;
    auVar105._4_4_ = auVar171._4_4_ + auVar35._4_4_;
    auVar105._8_4_ = auVar171._8_4_ + auVar35._8_4_;
    auVar105._12_4_ = auVar171._12_4_ + auVar35._12_4_;
    auVar105._16_4_ = auVar171._16_4_ + 0.0;
    auVar105._20_4_ = auVar171._20_4_ + 0.0;
    auVar105._24_4_ = auVar171._24_4_ + 0.0;
    auVar105._28_4_ = 0;
    auVar74 = ZEXT1632(auVar40);
    auVar67 = vpermt2ps_avx512vl(auVar171,_DAT_0205fd20,auVar74);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar37),auVar58);
    auVar56 = vpermt2ps_avx512vl(auVar58,_DAT_0205fd20,auVar74);
    auVar58 = vsubps_avx(auVar64,auVar67);
    auVar67 = vsubps_avx512vl(auVar66,auVar56);
    auVar56 = vmulps_avx512vl(auVar53,auVar71);
    auVar70 = vmulps_avx512vl(auVar72,auVar71);
    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar57);
    auVar57 = vfmadd231ps_avx512vl(auVar70,auVar59,auVar52);
    auVar52 = vmulps_avx512vl(auVar54,auVar71);
    auVar70 = vmulps_avx512vl(auVar73,auVar71);
    auVar52 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar53);
    auVar72 = vfmadd231ps_avx512vl(auVar70,auVar59,auVar72);
    auVar53 = vmulps_avx512vl(auVar55,auVar71);
    auVar55 = vmulps_avx512vl(auVar69,auVar71);
    auVar45 = vfmadd231ps_fma(auVar53,auVar59,auVar54);
    auVar46 = vfmadd231ps_fma(auVar55,auVar59,auVar73);
    auVar53 = vmulps_avx512vl(auVar71,auVar52);
    auVar55 = vmulps_avx512vl(ZEXT1632(auVar44),auVar72);
    auVar56 = vfmadd231ps_avx512vl(auVar53,auVar59,auVar56);
    auVar57 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar57);
    auVar52 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar199 * auVar45._12_4_,
                                            CONCAT48(fVar198 * auVar45._8_4_,
                                                     CONCAT44(fVar196 * auVar45._4_4_,
                                                              fVar194 * auVar45._0_4_)))),auVar59,
                         auVar52);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar199 * auVar46._12_4_,
                                            CONCAT48(fVar198 * auVar46._8_4_,
                                                     CONCAT44(fVar196 * auVar46._4_4_,
                                                              fVar194 * auVar46._0_4_)))),auVar59,
                         auVar72);
    auVar20._4_4_ = fVar196 * auVar52._4_4_;
    auVar20._0_4_ = fVar194 * auVar52._0_4_;
    auVar20._8_4_ = fVar198 * auVar52._8_4_;
    auVar20._12_4_ = fVar199 * auVar52._12_4_;
    auVar20._16_4_ = auVar52._16_4_ * 0.0;
    auVar20._20_4_ = auVar52._20_4_ * 0.0;
    auVar20._24_4_ = auVar52._24_4_ * 0.0;
    auVar20._28_4_ = auVar73._28_4_;
    auVar21._4_4_ = fVar196 * auVar72._4_4_;
    auVar21._0_4_ = fVar194 * auVar72._0_4_;
    auVar21._8_4_ = fVar198 * auVar72._8_4_;
    auVar21._12_4_ = fVar199 * auVar72._12_4_;
    auVar21._16_4_ = auVar72._16_4_ * 0.0;
    auVar21._20_4_ = auVar72._20_4_ * 0.0;
    auVar21._24_4_ = auVar72._24_4_ * 0.0;
    auVar21._28_4_ = auVar54._28_4_;
    auVar73 = vfmadd231ps_avx512vl(auVar20,auVar59,auVar56);
    auVar53 = vfmadd231ps_avx512vl(auVar21,auVar57,auVar59);
    auVar59 = vsubps_avx512vl(auVar52,auVar56);
    auVar72 = vsubps_avx512vl(auVar72,auVar57);
    auVar59 = vmulps_avx512vl(auVar59,auVar65);
    auVar72 = vmulps_avx512vl(auVar72,auVar65);
    fVar106 = fVar201 * auVar59._0_4_;
    fVar194 = fVar201 * auVar59._4_4_;
    auVar22._4_4_ = fVar194;
    auVar22._0_4_ = fVar106;
    fVar196 = fVar201 * auVar59._8_4_;
    auVar22._8_4_ = fVar196;
    fVar198 = fVar201 * auVar59._12_4_;
    auVar22._12_4_ = fVar198;
    fVar199 = fVar201 * auVar59._16_4_;
    auVar22._16_4_ = fVar199;
    fVar200 = fVar201 * auVar59._20_4_;
    auVar22._20_4_ = fVar200;
    fVar201 = fVar201 * auVar59._24_4_;
    auVar22._24_4_ = fVar201;
    auVar22._28_4_ = auVar59._28_4_;
    auVar72 = vmulps_avx512vl(auVar180,auVar72);
    auVar65 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar74);
    auVar56 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar74);
    auVar181._0_4_ = auVar73._0_4_ + fVar106;
    auVar181._4_4_ = auVar73._4_4_ + fVar194;
    auVar181._8_4_ = auVar73._8_4_ + fVar196;
    auVar181._12_4_ = auVar73._12_4_ + fVar198;
    auVar181._16_4_ = auVar73._16_4_ + fVar199;
    auVar181._20_4_ = auVar73._20_4_ + fVar200;
    auVar181._24_4_ = auVar73._24_4_ + fVar201;
    auVar181._28_4_ = auVar73._28_4_ + auVar59._28_4_;
    auVar59 = vpermt2ps_avx512vl(auVar22,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar57 = vaddps_avx512vl(auVar53,auVar72);
    auVar72 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar59 = vsubps_avx(auVar65,auVar59);
    auVar72 = vsubps_avx512vl(auVar56,auVar72);
    auVar121 = ZEXT1632(auVar35);
    auVar52 = vsubps_avx512vl(auVar73,auVar121);
    auVar129 = ZEXT1632(auVar37);
    auVar54 = vsubps_avx512vl(auVar53,auVar129);
    auVar55 = vsubps_avx512vl(auVar65,auVar64);
    auVar52 = vaddps_avx512vl(auVar52,auVar55);
    auVar55 = vsubps_avx512vl(auVar56,auVar66);
    auVar54 = vaddps_avx512vl(auVar54,auVar55);
    auVar55 = vmulps_avx512vl(auVar129,auVar52);
    auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar121,auVar54);
    auVar69 = vmulps_avx512vl(auVar68,auVar52);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar105,auVar54);
    auVar70 = vmulps_avx512vl(auVar67,auVar52);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar58,auVar54);
    auVar71 = vmulps_avx512vl(auVar66,auVar52);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar64,auVar54);
    auVar74 = vmulps_avx512vl(auVar53,auVar52);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar54);
    auVar75 = vmulps_avx512vl(auVar57,auVar52);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar181,auVar54);
    auVar76 = vmulps_avx512vl(auVar72,auVar52);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar59,auVar54);
    auVar52 = vmulps_avx512vl(auVar56,auVar52);
    auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar65,auVar54);
    auVar54 = vminps_avx512vl(auVar55,auVar69);
    auVar55 = vmaxps_avx512vl(auVar55,auVar69);
    auVar69 = vminps_avx512vl(auVar70,auVar71);
    auVar54 = vminps_avx512vl(auVar54,auVar69);
    auVar69 = vmaxps_avx512vl(auVar70,auVar71);
    auVar55 = vmaxps_avx512vl(auVar55,auVar69);
    auVar69 = vminps_avx512vl(auVar74,auVar75);
    auVar70 = vmaxps_avx512vl(auVar74,auVar75);
    auVar71 = vminps_avx512vl(auVar76,auVar52);
    auVar69 = vminps_avx512vl(auVar69,auVar71);
    auVar54 = vminps_avx512vl(auVar54,auVar69);
    auVar52 = vmaxps_avx512vl(auVar76,auVar52);
    auVar52 = vmaxps_avx512vl(auVar70,auVar52);
    auVar52 = vmaxps_avx512vl(auVar55,auVar52);
    uVar11 = vcmpps_avx512vl(auVar54,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar52,local_98,5);
    uVar27 = 0;
    bVar23 = (byte)uVar11 & (byte)uVar13 & 0x7f;
    if (bVar23 != 0) {
      auVar52 = vsubps_avx512vl(auVar64,auVar121);
      auVar54 = vsubps_avx512vl(auVar66,auVar129);
      auVar55 = vsubps_avx512vl(auVar65,auVar73);
      auVar52 = vaddps_avx512vl(auVar52,auVar55);
      auVar55 = vsubps_avx512vl(auVar56,auVar53);
      auVar54 = vaddps_avx512vl(auVar54,auVar55);
      auVar55 = vmulps_avx512vl(auVar129,auVar52);
      auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar121);
      auVar68 = vmulps_avx512vl(auVar68,auVar52);
      auVar68 = vfnmadd213ps_avx512vl(auVar105,auVar54,auVar68);
      auVar67 = vmulps_avx512vl(auVar67,auVar52);
      auVar67 = vfnmadd213ps_avx512vl(auVar58,auVar54,auVar67);
      auVar58 = vmulps_avx512vl(auVar66,auVar52);
      auVar66 = vfnmadd231ps_avx512vl(auVar58,auVar54,auVar64);
      auVar58 = vmulps_avx512vl(auVar53,auVar52);
      auVar53 = vfnmadd231ps_avx512vl(auVar58,auVar54,auVar73);
      auVar58 = vmulps_avx512vl(auVar57,auVar52);
      auVar57 = vfnmadd213ps_avx512vl(auVar181,auVar54,auVar58);
      auVar58 = vmulps_avx512vl(auVar72,auVar52);
      auVar69 = vfnmadd213ps_avx512vl(auVar59,auVar54,auVar58);
      auVar59 = vmulps_avx512vl(auVar56,auVar52);
      auVar56 = vfnmadd231ps_avx512vl(auVar59,auVar65,auVar54);
      auVar58 = vminps_avx(auVar55,auVar68);
      auVar59 = vmaxps_avx(auVar55,auVar68);
      auVar64 = vminps_avx(auVar67,auVar66);
      auVar64 = vminps_avx(auVar58,auVar64);
      auVar58 = vmaxps_avx(auVar67,auVar66);
      auVar59 = vmaxps_avx(auVar59,auVar58);
      auVar73 = vminps_avx(auVar53,auVar57);
      auVar58 = vmaxps_avx(auVar53,auVar57);
      auVar65 = vminps_avx(auVar69,auVar56);
      auVar73 = vminps_avx(auVar73,auVar65);
      auVar73 = vminps_avx(auVar64,auVar73);
      auVar64 = vmaxps_avx(auVar69,auVar56);
      auVar58 = vmaxps_avx(auVar58,auVar64);
      auVar59 = vmaxps_avx(auVar59,auVar58);
      uVar11 = vcmpps_avx512vl(auVar59,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar73,local_78,2);
      uVar27 = (uint)(bVar23 & (byte)uVar11 & (byte)uVar13);
    }
    if (uVar27 != 0) {
      auStack_168[uVar29] = uVar27;
      uVar11 = vmovlps_avx(auVar34);
      *(undefined8 *)(&uStack_d8 + uVar29 * 2) = uVar11;
      uVar25 = vmovlps_avx512f(auVar38);
      auStack_58[uVar29] = uVar25;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar232 = ZEXT1664(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar233 = ZEXT1664(auVar34);
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM19 = ZEXT3264(auVar59);
    auVar234 = ZEXT464(0x3f800000);
    auVar89._16_16_ = auVar59._16_16_;
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT1664(auVar34);
    auVar34 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
    auVar231 = ZEXT1664(auVar34);
    auVar238 = ZEXT1664(local_318);
    auVar89._0_16_ = local_328;
    auVar240 = ZEXT1664(local_328);
    do {
      auVar34 = auVar235._0_16_;
      if ((int)uVar29 == 0) {
        if (bVar32) {
          return bVar33;
        }
        fVar201 = ray->tfar;
        auVar15._4_4_ = fVar201;
        auVar15._0_4_ = fVar201;
        auVar15._8_4_ = fVar201;
        auVar15._12_4_ = fVar201;
        auVar15._16_4_ = fVar201;
        auVar15._20_4_ = fVar201;
        auVar15._24_4_ = fVar201;
        auVar15._28_4_ = fVar201;
        uVar11 = vcmpps_avx512vl(local_b8,auVar15,2);
        uVar31 = (uint)local_2d0 & (uint)local_338 & (uint)uVar11;
        local_2d0 = (ulong)uVar31;
        bVar33 = uVar31 != 0;
        if (!bVar33) {
          return bVar33;
        }
        goto LAB_01d9606c;
      }
      uVar24 = (int)uVar29 - 1;
      uVar26 = (ulong)uVar24;
      uVar27 = (&uStack_d8)[uVar26 * 2];
      fVar201 = afStack_d4[uVar26 * 2];
      uVar5 = auStack_168[uVar26];
      auVar224._8_8_ = 0;
      auVar224._0_8_ = auStack_58[uVar26];
      auVar230 = ZEXT1664(auVar224);
      lVar30 = 0;
      for (uVar25 = (ulong)uVar5; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar28 = uVar5 - 1 & uVar5;
      auStack_168[uVar26] = uVar28;
      if (uVar28 == 0) {
        uVar29 = (ulong)uVar24;
      }
      auVar45 = vpxord_avx512vl(auVar236._0_16_,auVar236._0_16_);
      auVar44 = vcvtsi2ss_avx512f(auVar45,lVar30);
      auVar46 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar44 = vpxord_avx512vl(auVar45,auVar45);
      auVar44 = vcvtsi2ss_avx512f(auVar44,lVar30);
      auVar44 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      auVar40 = auVar234._0_16_;
      auVar45 = vsubss_avx512f(auVar40,auVar46);
      local_348 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar46._0_4_)),ZEXT416(uVar27),auVar45);
      auVar45 = vsubss_avx512f(auVar40,auVar44);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar44._0_4_)),ZEXT416(uVar27),auVar45);
      fVar106 = auVar44._0_4_;
      fVar194 = local_348._0_4_;
      fVar201 = fVar106 - fVar194;
      vucomiss_avx512f(ZEXT416((uint)fVar201));
      if (uVar5 == 0 || lVar30 == 0) break;
      auVar236 = ZEXT1664(auVar224);
      auVar45 = vshufps_avx(auVar224,auVar224,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar201));
      auVar35 = vsubps_avx512vl(auVar34,auVar45);
      fVar196 = auVar45._0_4_;
      auVar116._0_4_ = fVar196 * (float)local_1b8._0_4_;
      fVar198 = auVar45._4_4_;
      auVar116._4_4_ = fVar198 * (float)local_1b8._4_4_;
      fVar199 = auVar45._8_4_;
      auVar116._8_4_ = fVar199 * fStack_1b0;
      fVar200 = auVar45._12_4_;
      auVar116._12_4_ = fVar200 * fStack_1ac;
      auVar126._0_4_ = fVar196 * (float)local_1c8._0_4_;
      auVar126._4_4_ = fVar198 * (float)local_1c8._4_4_;
      auVar126._8_4_ = fVar199 * fStack_1c0;
      auVar126._12_4_ = fVar200 * fStack_1bc;
      auVar135._0_4_ = fVar196 * (float)local_1d8._0_4_;
      auVar135._4_4_ = fVar198 * (float)local_1d8._4_4_;
      auVar135._8_4_ = fVar199 * fStack_1d0;
      auVar135._12_4_ = fVar200 * fStack_1cc;
      auVar99._0_4_ = fVar196 * (float)local_1e8._0_4_;
      auVar99._4_4_ = fVar198 * (float)local_1e8._4_4_;
      auVar99._8_4_ = fVar199 * fStack_1e0;
      auVar99._12_4_ = fVar200 * fStack_1dc;
      auVar45 = vfmadd231ps_fma(auVar116,auVar35,local_178);
      auVar46 = vfmadd231ps_fma(auVar126,auVar35,local_188);
      auVar36 = vfmadd231ps_fma(auVar135,auVar35,local_198);
      auVar35 = vfmadd231ps_fma(auVar99,auVar35,local_1a8);
      auVar113._16_16_ = auVar45;
      auVar113._0_16_ = auVar45;
      auVar122._16_16_ = auVar46;
      auVar122._0_16_ = auVar46;
      auVar130._16_16_ = auVar36;
      auVar130._0_16_ = auVar36;
      auVar148._4_4_ = fVar194;
      auVar148._0_4_ = fVar194;
      auVar148._8_4_ = fVar194;
      auVar148._12_4_ = fVar194;
      auVar148._20_4_ = fVar106;
      auVar148._16_4_ = fVar106;
      auVar148._24_4_ = fVar106;
      auVar148._28_4_ = fVar106;
      auVar59 = vsubps_avx(auVar122,auVar113);
      auVar46 = vfmadd213ps_fma(auVar59,auVar148,auVar113);
      auVar59 = vsubps_avx(auVar130,auVar122);
      auVar37 = vfmadd213ps_fma(auVar59,auVar148,auVar122);
      auVar45 = vsubps_avx(auVar35,auVar36);
      auVar123._16_16_ = auVar45;
      auVar123._0_16_ = auVar45;
      auVar45 = vfmadd213ps_fma(auVar123,auVar148,auVar130);
      auVar59 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar46));
      auVar46 = vfmadd213ps_fma(auVar59,auVar148,ZEXT1632(auVar46));
      auVar59 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar37));
      auVar45 = vfmadd213ps_fma(auVar59,auVar148,ZEXT1632(auVar37));
      auVar59 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar46));
      auVar47 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar59,auVar148);
      auVar59 = vmulps_avx512vl(auVar59,in_ZMM19._0_32_);
      auVar78._16_16_ = auVar59._16_16_;
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar201),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar106 = auVar45._0_4_;
      auVar136._0_8_ =
           CONCAT44(auVar47._4_4_ + fVar106 * auVar59._4_4_,auVar47._0_4_ + fVar106 * auVar59._0_4_)
      ;
      auVar136._8_4_ = auVar47._8_4_ + fVar106 * auVar59._8_4_;
      auVar136._12_4_ = auVar47._12_4_ + fVar106 * auVar59._12_4_;
      auVar117._0_4_ = fVar106 * auVar59._16_4_;
      auVar117._4_4_ = fVar106 * auVar59._20_4_;
      auVar117._8_4_ = fVar106 * auVar59._24_4_;
      auVar117._12_4_ = fVar106 * auVar59._28_4_;
      auVar51 = vsubps_avx((undefined1  [16])0x0,auVar117);
      auVar39 = vshufpd_avx(auVar47,auVar47,3);
      auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar45 = vsubps_avx(auVar39,auVar47);
      auVar46 = vsubps_avx(auVar41,(undefined1  [16])0x0);
      auVar150._0_4_ = auVar46._0_4_ + auVar45._0_4_;
      auVar150._4_4_ = auVar46._4_4_ + auVar45._4_4_;
      auVar150._8_4_ = auVar46._8_4_ + auVar45._8_4_;
      auVar150._12_4_ = auVar46._12_4_ + auVar45._12_4_;
      auVar45 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar46 = vshufps_avx(auVar136,auVar136,0xb1);
      auVar36 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar35 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar212._4_4_ = auVar150._0_4_;
      auVar212._0_4_ = auVar150._0_4_;
      auVar212._8_4_ = auVar150._0_4_;
      auVar212._12_4_ = auVar150._0_4_;
      auVar37 = vshufps_avx(auVar150,auVar150,0x55);
      fVar106 = auVar37._0_4_;
      auVar165._0_4_ = auVar45._0_4_ * fVar106;
      fVar194 = auVar37._4_4_;
      auVar165._4_4_ = auVar45._4_4_ * fVar194;
      fVar196 = auVar37._8_4_;
      auVar165._8_4_ = auVar45._8_4_ * fVar196;
      fVar198 = auVar37._12_4_;
      auVar165._12_4_ = auVar45._12_4_ * fVar198;
      auVar176._0_4_ = auVar46._0_4_ * fVar106;
      auVar176._4_4_ = auVar46._4_4_ * fVar194;
      auVar176._8_4_ = auVar46._8_4_ * fVar196;
      auVar176._12_4_ = auVar46._12_4_ * fVar198;
      auVar185._0_4_ = auVar36._0_4_ * fVar106;
      auVar185._4_4_ = auVar36._4_4_ * fVar194;
      auVar185._8_4_ = auVar36._8_4_ * fVar196;
      auVar185._12_4_ = auVar36._12_4_ * fVar198;
      auVar151._0_4_ = auVar35._0_4_ * fVar106;
      auVar151._4_4_ = auVar35._4_4_ * fVar194;
      auVar151._8_4_ = auVar35._8_4_ * fVar196;
      auVar151._12_4_ = auVar35._12_4_ * fVar198;
      auVar45 = vfmadd231ps_fma(auVar165,auVar212,auVar47);
      auVar46 = vfmadd231ps_fma(auVar176,auVar212,auVar136);
      auVar37 = vfmadd231ps_fma(auVar185,auVar212,auVar51);
      auVar97 = vfmadd231ps_fma(auVar151,(undefined1  [16])0x0,auVar212);
      auVar38 = vshufpd_avx(auVar45,auVar45,1);
      auVar42 = vshufpd_avx(auVar46,auVar46,1);
      auVar43 = vshufpd_avx(auVar37,auVar37,1);
      auVar49 = vshufpd_avx(auVar97,auVar97,1);
      auVar36 = vminss_avx(auVar45,auVar46);
      auVar45 = vmaxss_avx(auVar46,auVar45);
      auVar35 = vminss_avx(auVar37,auVar97);
      auVar46 = vmaxss_avx(auVar97,auVar37);
      auVar35 = vminss_avx(auVar36,auVar35);
      auVar45 = vmaxss_avx(auVar46,auVar45);
      auVar37 = vminss_avx(auVar38,auVar42);
      auVar46 = vmaxss_avx(auVar42,auVar38);
      auVar38 = vminss_avx(auVar43,auVar49);
      auVar36 = vmaxss_avx(auVar49,auVar43);
      auVar37 = vminss_avx(auVar37,auVar38);
      auVar46 = vmaxss_avx(auVar36,auVar46);
      fVar196 = auVar35._0_4_;
      fVar194 = auVar46._0_4_;
      fVar106 = auVar45._0_4_;
      if ((0.0001 <= fVar196) || (fVar194 <= -0.0001)) {
        uVar11 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar35,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar106 & ((byte)uVar13 | (byte)uVar11)) != 0) goto LAB_01d96ebe;
        uVar11 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar46,5);
        uVar13 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar11) & 1) == 0) goto LAB_01d96ebe;
LAB_01d97b36:
        bVar12 = true;
        auVar89._16_16_ = auVar78._16_16_;
        auVar89._0_16_ = auVar224;
        auVar230 = ZEXT1664(auVar224);
      }
      else {
LAB_01d96ebe:
        uVar11 = vcmpss_avx512f(auVar35,auVar231._0_16_,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        iVar90 = auVar234._0_4_;
        fVar198 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar90);
        uVar11 = vcmpss_avx512f(auVar45,ZEXT816(0) << 0x20,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar199 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar90);
        auVar78._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)(fVar198 == fVar199) * 0x7f800000;
        auVar38 = auVar77._0_16_;
        auVar80._16_16_ = auVar78._16_16_;
        auVar80._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar79._4_28_ = auVar80._4_28_;
        auVar79._0_4_ = (uint)(fVar198 == fVar199) * -0x800000;
        auVar36 = auVar79._0_16_;
        uVar11 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x20,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar200 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar90);
        auVar42 = ZEXT416(0xbf800000);
        if ((fVar198 != fVar200) || (NAN(fVar198) || NAN(fVar200))) {
          fVar198 = auVar37._0_4_;
          bVar12 = fVar198 == fVar196;
          if ((!bVar12) || (NAN(fVar198) || NAN(fVar196))) {
            auVar35 = vxorps_avx512vl(auVar35,auVar233._0_16_);
            auVar225._0_4_ = auVar35._0_4_ / (fVar198 - fVar196);
            auVar225._4_12_ = auVar35._4_12_;
            auVar35 = vsubss_avx512f(auVar40,auVar225);
            auVar42 = vxorps_avx512vl(auVar42,auVar42);
            auVar37 = vfmadd213ss_avx512f(auVar35,auVar42,auVar225);
            auVar35 = auVar37;
          }
          else {
            auVar42 = vxorps_avx512vl(auVar42,auVar42);
            vucomiss_avx512f(auVar42);
            auVar82._16_16_ = auVar78._16_16_;
            auVar82._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar81._4_28_ = auVar82._4_28_;
            auVar81._0_4_ = (uint)bVar12 * auVar42._0_4_ + (uint)!bVar12 * 0x7f800000;
            auVar37 = auVar81._0_16_;
            auVar35 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar37);
          auVar36 = vmaxss_avx(auVar35,auVar36);
        }
        else {
          auVar42 = vxorps_avx512vl(auVar42,auVar42);
        }
        auVar231 = ZEXT1664(auVar42);
        uVar11 = vcmpss_avx512f(auVar46,auVar42,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar196 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar90);
        if ((fVar199 != fVar196) || (NAN(fVar199) || NAN(fVar196))) {
          bVar12 = fVar194 == fVar106;
          if ((!bVar12) || (NAN(fVar194) || NAN(fVar106))) {
            auVar45 = vxorps_avx512vl(auVar45,auVar233._0_16_);
            auVar186._0_4_ = auVar45._0_4_ / (fVar194 - fVar106);
            auVar186._4_12_ = auVar45._4_12_;
            auVar45 = vsubss_avx512f(auVar40,auVar186);
            auVar46 = vfmadd213ss_avx512f(auVar45,auVar42,auVar186);
            auVar45 = auVar46;
          }
          else {
            vucomiss_avx512f(auVar42);
            auVar84._16_16_ = auVar78._16_16_;
            auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar83._4_28_ = auVar84._4_28_;
            auVar83._0_4_ = (uint)bVar12 * auVar42._0_4_ + (uint)!bVar12 * 0x7f800000;
            auVar46 = auVar83._0_16_;
            auVar45 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar46);
          auVar36 = vmaxss_avx(auVar45,auVar36);
        }
        bVar12 = fVar200 != fVar196;
        auVar45 = vminss_avx512f(auVar38,auVar40);
        auVar86._16_16_ = auVar78._16_16_;
        auVar86._0_16_ = auVar38;
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (uint)bVar12 * auVar45._0_4_ + (uint)!bVar12 * auVar38._0_4_;
        auVar45 = vmaxss_avx512f(auVar40,auVar36);
        auVar88._16_16_ = auVar78._16_16_;
        auVar88._0_16_ = auVar36;
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (uint)bVar12 * auVar45._0_4_ + (uint)!bVar12 * auVar36._0_4_;
        auVar45 = vmaxss_avx512f(auVar42,auVar85._0_16_);
        auVar46 = vminss_avx512f(auVar87._0_16_,auVar40);
        bVar12 = true;
        if (auVar46._0_4_ < auVar45._0_4_) goto LAB_01d97b36;
        auVar35 = vmaxss_avx512f(auVar42,ZEXT416((uint)(auVar45._0_4_ + -0.1)));
        auVar42 = vminss_avx512f(ZEXT416((uint)(auVar46._0_4_ + 0.1)),auVar40);
        auVar100._0_8_ = auVar47._0_8_;
        auVar100._8_8_ = auVar100._0_8_;
        auVar177._8_8_ = auVar136._0_8_;
        auVar177._0_8_ = auVar136._0_8_;
        auVar187._8_8_ = auVar51._0_8_;
        auVar187._0_8_ = auVar51._0_8_;
        auVar45 = vshufpd_avx(auVar136,auVar136,3);
        auVar46 = vshufpd_avx(auVar51,auVar51,3);
        auVar36 = vshufps_avx(auVar35,auVar42,0);
        auVar43 = vsubps_avx512vl(auVar34,auVar36);
        fVar106 = auVar36._0_4_;
        auVar221._0_4_ = fVar106 * auVar39._0_4_;
        fVar194 = auVar36._4_4_;
        auVar221._4_4_ = fVar194 * auVar39._4_4_;
        fVar196 = auVar36._8_4_;
        auVar221._8_4_ = fVar196 * auVar39._8_4_;
        fVar198 = auVar36._12_4_;
        auVar221._12_4_ = fVar198 * auVar39._12_4_;
        auVar137._0_4_ = fVar106 * auVar45._0_4_;
        auVar137._4_4_ = fVar194 * auVar45._4_4_;
        auVar137._8_4_ = fVar196 * auVar45._8_4_;
        auVar137._12_4_ = fVar198 * auVar45._12_4_;
        auVar144._0_4_ = fVar106 * auVar46._0_4_;
        auVar144._4_4_ = fVar194 * auVar46._4_4_;
        auVar144._8_4_ = fVar196 * auVar46._8_4_;
        auVar144._12_4_ = fVar198 * auVar46._12_4_;
        auVar118._0_4_ = fVar106 * auVar41._0_4_;
        auVar118._4_4_ = fVar194 * auVar41._4_4_;
        auVar118._8_4_ = fVar196 * auVar41._8_4_;
        auVar118._12_4_ = fVar198 * auVar41._12_4_;
        auVar37 = vfmadd231ps_fma(auVar221,auVar43,auVar100);
        auVar38 = vfmadd231ps_fma(auVar137,auVar43,auVar177);
        auVar39 = vfmadd231ps_fma(auVar144,auVar43,auVar187);
        auVar41 = vfmadd231ps_fma(auVar118,auVar43,ZEXT816(0));
        auVar45 = vsubss_avx512f(auVar40,auVar35);
        auVar46 = vmovshdup_avx512vl(auVar224);
        auVar47 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar35._0_4_)),auVar224,
                                      auVar45);
        auVar45 = vsubss_avx512f(auVar40,auVar42);
        auVar48 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar46._0_4_)),auVar224,
                                      auVar45);
        auVar42 = vdivss_avx512f(auVar40,ZEXT416((uint)fVar201));
        auVar45 = vsubps_avx(auVar38,auVar37);
        auVar124 = auVar241._0_16_;
        auVar36 = vmulps_avx512vl(auVar45,auVar124);
        auVar45 = vsubps_avx(auVar39,auVar38);
        auVar35 = vmulps_avx512vl(auVar45,auVar124);
        auVar45 = vsubps_avx(auVar41,auVar39);
        auVar45 = vmulps_avx512vl(auVar45,auVar124);
        auVar46 = vminps_avx(auVar35,auVar45);
        auVar45 = vmaxps_avx(auVar35,auVar45);
        auVar46 = vminps_avx(auVar36,auVar46);
        auVar45 = vmaxps_avx(auVar36,auVar45);
        auVar36 = vshufpd_avx(auVar46,auVar46,3);
        auVar35 = vshufpd_avx(auVar45,auVar45,3);
        auVar46 = vminps_avx(auVar46,auVar36);
        auVar45 = vmaxps_avx(auVar45,auVar35);
        fVar201 = auVar42._0_4_;
        auVar166._0_4_ = fVar201 * auVar46._0_4_;
        auVar166._4_4_ = fVar201 * auVar46._4_4_;
        auVar166._8_4_ = fVar201 * auVar46._8_4_;
        auVar166._12_4_ = fVar201 * auVar46._12_4_;
        auVar152._0_4_ = fVar201 * auVar45._0_4_;
        auVar152._4_4_ = fVar201 * auVar45._4_4_;
        auVar152._8_4_ = fVar201 * auVar45._8_4_;
        auVar152._12_4_ = fVar201 * auVar45._12_4_;
        auVar42 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar48._0_4_ - auVar47._0_4_)));
        auVar45 = vshufpd_avx(auVar37,auVar37,3);
        auVar46 = vshufpd_avx(auVar38,auVar38,3);
        auVar36 = vshufpd_avx(auVar39,auVar39,3);
        auVar35 = vshufpd_avx(auVar41,auVar41,3);
        auVar45 = vsubps_avx(auVar45,auVar37);
        auVar37 = vsubps_avx(auVar46,auVar38);
        auVar38 = vsubps_avx(auVar36,auVar39);
        auVar35 = vsubps_avx(auVar35,auVar41);
        auVar46 = vminps_avx(auVar45,auVar37);
        auVar45 = vmaxps_avx(auVar45,auVar37);
        auVar36 = vminps_avx(auVar38,auVar35);
        auVar36 = vminps_avx(auVar46,auVar36);
        auVar46 = vmaxps_avx(auVar38,auVar35);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        fVar201 = auVar42._0_4_;
        auVar188._0_4_ = fVar201 * auVar36._0_4_;
        auVar188._4_4_ = fVar201 * auVar36._4_4_;
        auVar188._8_4_ = fVar201 * auVar36._8_4_;
        auVar188._12_4_ = fVar201 * auVar36._12_4_;
        auVar204._0_4_ = fVar201 * auVar45._0_4_;
        auVar204._4_4_ = fVar201 * auVar45._4_4_;
        auVar204._8_4_ = fVar201 * auVar45._8_4_;
        auVar204._12_4_ = fVar201 * auVar45._12_4_;
        auVar236 = ZEXT1664(local_348);
        auVar97 = vinsertps_avx512f(local_348,auVar47,0x10);
        auVar37 = vinsertps_avx(auVar44,auVar48,0x10);
        auVar92._0_4_ = auVar97._0_4_ + auVar37._0_4_;
        auVar92._4_4_ = auVar97._4_4_ + auVar37._4_4_;
        auVar92._8_4_ = auVar97._8_4_ + auVar37._8_4_;
        auVar92._12_4_ = auVar97._12_4_ + auVar37._12_4_;
        auVar14._8_4_ = 0x3f000000;
        auVar14._0_8_ = 0x3f0000003f000000;
        auVar14._12_4_ = 0x3f000000;
        auVar49 = vmulps_avx512vl(auVar92,auVar14);
        auVar36 = vshufps_avx(auVar49,auVar49,0x54);
        uVar91 = auVar49._0_4_;
        auVar107._4_4_ = uVar91;
        auVar107._0_4_ = uVar91;
        auVar107._8_4_ = uVar91;
        auVar107._12_4_ = uVar91;
        auVar38 = vfmadd213ps_avx512vl(auVar238._0_16_,auVar107,auVar239._0_16_);
        auVar46 = vfmadd213ps_fma(auVar240._0_16_,auVar107,local_2f8);
        auVar35 = vfmadd213ps_fma(local_e8,auVar107,local_308);
        auVar45 = vsubps_avx(auVar46,auVar38);
        auVar38 = vfmadd213ps_fma(auVar45,auVar107,auVar38);
        auVar45 = vsubps_avx(auVar35,auVar46);
        auVar45 = vfmadd213ps_fma(auVar45,auVar107,auVar46);
        auVar45 = vsubps_avx(auVar45,auVar38);
        auVar46 = vfmadd231ps_fma(auVar38,auVar45,auVar107);
        auVar39 = vmulps_avx512vl(auVar45,auVar124);
        auVar213._8_8_ = auVar46._0_8_;
        auVar213._0_8_ = auVar46._0_8_;
        auVar45 = vshufpd_avx(auVar46,auVar46,3);
        auVar46 = vshufps_avx(auVar49,auVar49,0x55);
        auVar35 = vsubps_avx(auVar45,auVar213);
        auVar38 = vfmadd231ps_fma(auVar213,auVar46,auVar35);
        auVar226._8_8_ = auVar39._0_8_;
        auVar226._0_8_ = auVar39._0_8_;
        auVar45 = vshufpd_avx(auVar39,auVar39,3);
        auVar45 = vsubps_avx(auVar45,auVar226);
        auVar46 = vfmadd213ps_fma(auVar45,auVar46,auVar226);
        auVar108._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
        auVar108._8_4_ = auVar35._8_4_ ^ 0x80000000;
        auVar108._12_4_ = auVar35._12_4_ ^ 0x80000000;
        auVar45 = vmovshdup_avx(auVar46);
        auVar227._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
        auVar227._8_4_ = auVar45._8_4_ ^ 0x80000000;
        auVar227._12_4_ = auVar45._12_4_ ^ 0x80000000;
        auVar39 = vmovshdup_avx512vl(auVar35);
        auVar41 = vpermt2ps_avx512vl(auVar227,ZEXT416(5),auVar35);
        auVar45 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar35._0_4_)),auVar46,auVar39
                                     );
        auVar46 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar108);
        auVar119._0_4_ = auVar45._0_4_;
        auVar119._4_4_ = auVar119._0_4_;
        auVar119._8_4_ = auVar119._0_4_;
        auVar119._12_4_ = auVar119._0_4_;
        auVar45 = vdivps_avx(auVar41,auVar119);
        auVar46 = vdivps_avx(auVar46,auVar119);
        fVar106 = auVar38._0_4_;
        auVar35 = vshufps_avx(auVar38,auVar38,0x55);
        fVar201 = auVar46._0_4_;
        auVar214._0_4_ = fVar106 * auVar45._0_4_ + auVar35._0_4_ * fVar201;
        auVar214._4_4_ = fVar106 * auVar45._4_4_ + auVar35._4_4_ * auVar46._4_4_;
        auVar214._8_4_ = fVar106 * auVar45._8_4_ + auVar35._8_4_ * auVar46._8_4_;
        auVar214._12_4_ = fVar106 * auVar45._12_4_ + auVar35._12_4_ * auVar46._12_4_;
        auVar51 = vsubps_avx(auVar36,auVar214);
        auVar38 = vmovshdup_avx(auVar45);
        auVar36 = vinsertps_avx(auVar166,auVar188,0x1c);
        auVar228._0_4_ = auVar38._0_4_ * auVar36._0_4_;
        auVar228._4_4_ = auVar38._4_4_ * auVar36._4_4_;
        auVar228._8_4_ = auVar38._8_4_ * auVar36._8_4_;
        auVar228._12_4_ = auVar38._12_4_ * auVar36._12_4_;
        auVar35 = vinsertps_avx(auVar152,auVar204,0x1c);
        auVar215._0_4_ = auVar38._0_4_ * auVar35._0_4_;
        auVar215._4_4_ = auVar38._4_4_ * auVar35._4_4_;
        auVar215._8_4_ = auVar38._8_4_ * auVar35._8_4_;
        auVar215._12_4_ = auVar38._12_4_ * auVar35._12_4_;
        auVar43 = vminps_avx512vl(auVar228,auVar215);
        auVar41 = vmaxps_avx(auVar215,auVar228);
        auVar42 = vmovshdup_avx(auVar46);
        auVar38 = vinsertps_avx(auVar188,auVar166,0x4c);
        auVar189._0_4_ = auVar42._0_4_ * auVar38._0_4_;
        auVar189._4_4_ = auVar42._4_4_ * auVar38._4_4_;
        auVar189._8_4_ = auVar42._8_4_ * auVar38._8_4_;
        auVar189._12_4_ = auVar42._12_4_ * auVar38._12_4_;
        auVar39 = vinsertps_avx(auVar204,auVar152,0x4c);
        auVar205._0_4_ = auVar42._0_4_ * auVar39._0_4_;
        auVar205._4_4_ = auVar42._4_4_ * auVar39._4_4_;
        auVar205._8_4_ = auVar42._8_4_ * auVar39._8_4_;
        auVar205._12_4_ = auVar42._12_4_ * auVar39._12_4_;
        auVar42 = vminps_avx(auVar189,auVar205);
        auVar43 = vaddps_avx512vl(auVar43,auVar42);
        auVar42 = vmaxps_avx(auVar205,auVar189);
        auVar190._0_4_ = auVar41._0_4_ + auVar42._0_4_;
        auVar190._4_4_ = auVar41._4_4_ + auVar42._4_4_;
        auVar190._8_4_ = auVar41._8_4_ + auVar42._8_4_;
        auVar190._12_4_ = auVar41._12_4_ + auVar42._12_4_;
        auVar206._8_8_ = 0x3f80000000000000;
        auVar206._0_8_ = 0x3f80000000000000;
        auVar41 = vsubps_avx(auVar206,auVar190);
        auVar42 = vsubps_avx(auVar206,auVar43);
        auVar43 = vsubps_avx(auVar97,auVar49);
        auVar49 = vsubps_avx(auVar37,auVar49);
        fVar199 = auVar43._0_4_;
        auVar229._0_4_ = fVar199 * auVar41._0_4_;
        fVar200 = auVar43._4_4_;
        auVar229._4_4_ = fVar200 * auVar41._4_4_;
        fVar96 = auVar43._8_4_;
        auVar229._8_4_ = fVar96 * auVar41._8_4_;
        fVar114 = auVar43._12_4_;
        auVar229._12_4_ = fVar114 * auVar41._12_4_;
        auVar50 = vbroadcastss_avx512vl(auVar45);
        auVar36 = vmulps_avx512vl(auVar50,auVar36);
        auVar35 = vmulps_avx512vl(auVar50,auVar35);
        auVar50 = vminps_avx512vl(auVar36,auVar35);
        auVar36 = vmaxps_avx(auVar35,auVar36);
        auVar167._0_4_ = fVar201 * auVar38._0_4_;
        auVar167._4_4_ = fVar201 * auVar38._4_4_;
        auVar167._8_4_ = fVar201 * auVar38._8_4_;
        auVar167._12_4_ = fVar201 * auVar38._12_4_;
        auVar153._0_4_ = fVar201 * auVar39._0_4_;
        auVar153._4_4_ = fVar201 * auVar39._4_4_;
        auVar153._8_4_ = fVar201 * auVar39._8_4_;
        auVar153._12_4_ = fVar201 * auVar39._12_4_;
        auVar35 = vminps_avx(auVar167,auVar153);
        auVar38 = vaddps_avx512vl(auVar50,auVar35);
        auVar39 = vmulps_avx512vl(auVar43,auVar42);
        fVar106 = auVar49._0_4_;
        auVar191._0_4_ = fVar106 * auVar41._0_4_;
        fVar194 = auVar49._4_4_;
        auVar191._4_4_ = fVar194 * auVar41._4_4_;
        fVar196 = auVar49._8_4_;
        auVar191._8_4_ = fVar196 * auVar41._8_4_;
        fVar198 = auVar49._12_4_;
        auVar191._12_4_ = fVar198 * auVar41._12_4_;
        auVar207._0_4_ = fVar106 * auVar42._0_4_;
        auVar207._4_4_ = fVar194 * auVar42._4_4_;
        auVar207._8_4_ = fVar196 * auVar42._8_4_;
        auVar207._12_4_ = fVar198 * auVar42._12_4_;
        auVar35 = vmaxps_avx(auVar153,auVar167);
        auVar154._0_4_ = auVar36._0_4_ + auVar35._0_4_;
        auVar154._4_4_ = auVar36._4_4_ + auVar35._4_4_;
        auVar154._8_4_ = auVar36._8_4_ + auVar35._8_4_;
        auVar154._12_4_ = auVar36._12_4_ + auVar35._12_4_;
        auVar168._8_8_ = 0x3f800000;
        auVar168._0_8_ = 0x3f800000;
        auVar36 = vsubps_avx(auVar168,auVar154);
        auVar35 = vsubps_avx(auVar168,auVar38);
        auVar222._0_4_ = fVar199 * auVar36._0_4_;
        auVar222._4_4_ = fVar200 * auVar36._4_4_;
        auVar222._8_4_ = fVar96 * auVar36._8_4_;
        auVar222._12_4_ = fVar114 * auVar36._12_4_;
        auVar216._0_4_ = fVar199 * auVar35._0_4_;
        auVar216._4_4_ = fVar200 * auVar35._4_4_;
        auVar216._8_4_ = fVar96 * auVar35._8_4_;
        auVar216._12_4_ = fVar114 * auVar35._12_4_;
        auVar155._0_4_ = fVar106 * auVar36._0_4_;
        auVar155._4_4_ = fVar194 * auVar36._4_4_;
        auVar155._8_4_ = fVar196 * auVar36._8_4_;
        auVar155._12_4_ = fVar198 * auVar36._12_4_;
        auVar169._0_4_ = fVar106 * auVar35._0_4_;
        auVar169._4_4_ = fVar194 * auVar35._4_4_;
        auVar169._8_4_ = fVar196 * auVar35._8_4_;
        auVar169._12_4_ = fVar198 * auVar35._12_4_;
        auVar36 = vminps_avx(auVar222,auVar216);
        auVar35 = vminps_avx(auVar155,auVar169);
        auVar38 = vminps_avx(auVar36,auVar35);
        auVar36 = vmaxps_avx(auVar216,auVar222);
        auVar35 = vmaxps_avx(auVar169,auVar155);
        auVar35 = vmaxps_avx(auVar35,auVar36);
        auVar41 = vminps_avx512vl(auVar229,auVar39);
        auVar36 = vminps_avx(auVar191,auVar207);
        auVar36 = vminps_avx(auVar41,auVar36);
        auVar36 = vhaddps_avx(auVar38,auVar36);
        auVar41 = vmaxps_avx512vl(auVar39,auVar229);
        auVar38 = vmaxps_avx(auVar207,auVar191);
        auVar38 = vmaxps_avx(auVar38,auVar41);
        auVar35 = vhaddps_avx(auVar35,auVar38);
        auVar36 = vshufps_avx(auVar36,auVar36,0xe8);
        auVar35 = vshufps_avx(auVar35,auVar35,0xe8);
        auVar156._0_4_ = auVar36._0_4_ + auVar51._0_4_;
        auVar156._4_4_ = auVar36._4_4_ + auVar51._4_4_;
        auVar156._8_4_ = auVar36._8_4_ + auVar51._8_4_;
        auVar156._12_4_ = auVar36._12_4_ + auVar51._12_4_;
        auVar170._0_4_ = auVar35._0_4_ + auVar51._0_4_;
        auVar170._4_4_ = auVar35._4_4_ + auVar51._4_4_;
        auVar170._8_4_ = auVar35._8_4_ + auVar51._8_4_;
        auVar170._12_4_ = auVar35._12_4_ + auVar51._12_4_;
        auVar36 = vmaxps_avx(auVar97,auVar156);
        auVar35 = vminps_avx(auVar170,auVar37);
        uVar25 = vcmpps_avx512vl(auVar35,auVar36,1);
        local_298 = vinsertps_avx(auVar47,auVar48,0x10);
        auVar230 = ZEXT1664(local_298);
        if ((uVar25 & 3) == 0) {
          vucomiss_avx512f(local_348);
          auVar36 = vxorps_avx512vl(auVar39,auVar39);
          auVar231 = ZEXT1664(auVar36);
          auVar89._16_16_ = auVar78._16_16_;
          auVar89._0_16_ = local_358;
          auVar239 = ZEXT1664(local_358);
          if ((uint)uVar29 < 4 && (uVar5 == 0 || lVar30 == 0)) {
            bVar12 = false;
          }
          else {
            lVar30 = 200;
            do {
              auVar35 = vsubss_avx512f(auVar40,auVar51);
              fVar196 = auVar35._0_4_;
              fVar106 = fVar196 * fVar196 * fVar196;
              fVar198 = auVar51._0_4_;
              fVar194 = fVar198 * 3.0 * fVar196 * fVar196;
              fVar196 = fVar196 * fVar198 * fVar198 * 3.0;
              auVar138._4_4_ = fVar106;
              auVar138._0_4_ = fVar106;
              auVar138._8_4_ = fVar106;
              auVar138._12_4_ = fVar106;
              auVar127._4_4_ = fVar194;
              auVar127._0_4_ = fVar194;
              auVar127._8_4_ = fVar194;
              auVar127._12_4_ = fVar194;
              auVar101._4_4_ = fVar196;
              auVar101._0_4_ = fVar196;
              auVar101._8_4_ = fVar196;
              auVar101._12_4_ = fVar196;
              fVar198 = fVar198 * fVar198 * fVar198;
              auVar145._0_4_ = (float)local_1f8._0_4_ * fVar198;
              auVar145._4_4_ = (float)local_1f8._4_4_ * fVar198;
              auVar145._8_4_ = fStack_1f0 * fVar198;
              auVar145._12_4_ = fStack_1ec * fVar198;
              auVar35 = vfmadd231ps_fma(auVar145,local_308,auVar101);
              auVar35 = vfmadd231ps_fma(auVar35,local_2f8,auVar127);
              auVar35 = vfmadd231ps_avx512vl(auVar35,local_358,auVar138);
              auVar102._8_8_ = auVar35._0_8_;
              auVar102._0_8_ = auVar35._0_8_;
              auVar35 = vshufpd_avx(auVar35,auVar35,3);
              auVar37 = vshufps_avx(auVar51,auVar51,0x55);
              auVar35 = vsubps_avx(auVar35,auVar102);
              auVar37 = vfmadd213ps_fma(auVar35,auVar37,auVar102);
              fVar106 = auVar37._0_4_;
              auVar35 = vshufps_avx(auVar37,auVar37,0x55);
              auVar103._0_4_ = auVar45._0_4_ * fVar106 + fVar201 * auVar35._0_4_;
              auVar103._4_4_ = auVar45._4_4_ * fVar106 + auVar46._4_4_ * auVar35._4_4_;
              auVar103._8_4_ = auVar45._8_4_ * fVar106 + auVar46._8_4_ * auVar35._8_4_;
              auVar103._12_4_ = auVar45._12_4_ * fVar106 + auVar46._12_4_ * auVar35._12_4_;
              auVar51 = vsubps_avx(auVar51,auVar103);
              auVar35 = vandps_avx512vl(auVar37,auVar232._0_16_);
              auVar89._0_16_ = vprolq_avx512vl(auVar35,0x20);
              auVar35 = vmaxss_avx(auVar89._0_16_,auVar35);
              bVar10 = auVar35._0_4_ <= (float)local_208._0_4_;
              if (auVar35._0_4_ < (float)local_208._0_4_) {
                auVar45 = vucomiss_avx512f(auVar36);
                if (bVar10) {
                  auVar46 = vucomiss_avx512f(auVar45);
                  auVar234 = ZEXT1664(auVar46);
                  if (bVar10) {
                    vmovshdup_avx(auVar45);
                    auVar46 = vucomiss_avx512f(auVar36);
                    if (bVar10) {
                      auVar40 = vucomiss_avx512f(auVar46);
                      auVar234 = ZEXT1664(auVar40);
                      if (bVar10) {
                        auVar35 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar49 = vinsertps_avx(auVar35,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->org).field_0;
                        auVar35 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                        auVar35 = vdpps_avx(auVar35,auVar49,0x7f);
                        auVar37 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar37 = vdpps_avx(auVar37,auVar49,0x7f);
                        auVar38 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                        auVar38 = vdpps_avx(auVar38,auVar49,0x7f);
                        auVar39 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                        auVar39 = vdpps_avx(auVar39,auVar49,0x7f);
                        auVar41 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                        auVar41 = vdpps_avx(auVar41,auVar49,0x7f);
                        auVar42 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar42 = vdpps_avx(auVar42,auVar49,0x7f);
                        auVar43 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                        auVar43 = vdpps_avx(auVar43,auVar49,0x7f);
                        auVar51 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                        auVar49 = vdpps_avx(auVar51,auVar49,0x7f);
                        auVar51 = vsubss_avx512f(auVar40,auVar46);
                        fVar201 = auVar46._0_4_;
                        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar201)),auVar51,
                                                  auVar35);
                        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar201)),auVar51,
                                                  auVar37);
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar201)),auVar51,
                                                  auVar38);
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar49._0_4_)),auVar51,
                                                  auVar39);
                        auVar89._0_16_ = vsubss_avx512f(auVar40,auVar45);
                        auVar146._0_4_ = auVar89._0_4_;
                        fVar201 = auVar146._0_4_ * auVar146._0_4_ * auVar146._0_4_;
                        fVar196 = auVar45._0_4_;
                        fVar106 = fVar196 * 3.0 * auVar146._0_4_ * auVar146._0_4_;
                        fVar194 = auVar146._0_4_ * fVar196 * fVar196 * 3.0;
                        fVar199 = fVar196 * fVar196 * fVar196;
                        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * auVar38._0_4_)),
                                                  ZEXT416((uint)fVar194),auVar37);
                        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar106),auVar35);
                        auVar46 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar201),auVar46);
                        fVar198 = auVar46._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar198) &&
                           (fVar200 = ray->tfar, fVar198 <= fVar200)) {
                          auVar46 = vshufps_avx(auVar45,auVar45,0x55);
                          auVar35 = vsubps_avx512vl(auVar34,auVar46);
                          fVar96 = auVar46._0_4_;
                          auVar178._0_4_ = fVar96 * (float)local_228._0_4_;
                          fVar114 = auVar46._4_4_;
                          auVar178._4_4_ = fVar114 * (float)local_228._4_4_;
                          fVar93 = auVar46._8_4_;
                          auVar178._8_4_ = fVar93 * fStack_220;
                          fVar94 = auVar46._12_4_;
                          auVar178._12_4_ = fVar94 * fStack_21c;
                          auVar192._0_4_ = fVar96 * (float)local_278._0_4_;
                          auVar192._4_4_ = fVar114 * (float)local_278._4_4_;
                          auVar192._8_4_ = fVar93 * fStack_270;
                          auVar192._12_4_ = fVar94 * fStack_26c;
                          auVar208._0_4_ = fVar96 * (float)local_288._0_4_;
                          auVar208._4_4_ = fVar114 * (float)local_288._4_4_;
                          auVar208._8_4_ = fVar93 * fStack_280;
                          auVar208._12_4_ = fVar94 * fStack_27c;
                          auVar157._0_4_ = fVar96 * (float)local_248._0_4_;
                          auVar157._4_4_ = fVar114 * (float)local_248._4_4_;
                          auVar157._8_4_ = fVar93 * fStack_240;
                          auVar157._12_4_ = fVar94 * fStack_23c;
                          auVar34 = vfmadd231ps_fma(auVar178,auVar35,local_218);
                          auVar46 = vfmadd231ps_fma(auVar192,auVar35,local_258);
                          auVar40 = vfmadd231ps_fma(auVar208,auVar35,local_268);
                          auVar35 = vfmadd231ps_fma(auVar157,auVar35,local_238);
                          auVar34 = vsubps_avx(auVar46,auVar34);
                          auVar46 = vsubps_avx(auVar40,auVar46);
                          auVar40 = vsubps_avx(auVar35,auVar40);
                          auVar209._0_4_ = fVar196 * auVar46._0_4_;
                          auVar209._4_4_ = fVar196 * auVar46._4_4_;
                          auVar209._8_4_ = fVar196 * auVar46._8_4_;
                          auVar209._12_4_ = fVar196 * auVar46._12_4_;
                          auVar146._4_4_ = auVar146._0_4_;
                          auVar146._8_4_ = auVar146._0_4_;
                          auVar146._12_4_ = auVar146._0_4_;
                          auVar34 = vfmadd231ps_fma(auVar209,auVar146,auVar34);
                          auVar158._0_4_ = fVar196 * auVar40._0_4_;
                          auVar158._4_4_ = fVar196 * auVar40._4_4_;
                          auVar158._8_4_ = fVar196 * auVar40._8_4_;
                          auVar158._12_4_ = fVar196 * auVar40._12_4_;
                          auVar46 = vfmadd231ps_fma(auVar158,auVar146,auVar46);
                          auVar159._0_4_ = fVar196 * auVar46._0_4_;
                          auVar159._4_4_ = fVar196 * auVar46._4_4_;
                          auVar159._8_4_ = fVar196 * auVar46._8_4_;
                          auVar159._12_4_ = fVar196 * auVar46._12_4_;
                          auVar34 = vfmadd231ps_fma(auVar159,auVar146,auVar34);
                          auVar89._0_16_ = vmulps_avx512vl(auVar34,auVar124);
                          pGVar6 = (context->scene->geometries).items[uVar31].ptr;
                          if ((pGVar6->mask & ray->mask) == 0) {
                            bVar10 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar10 = true,
                                  pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar139._0_4_ = fVar199 * (float)local_128._0_4_;
                            auVar139._4_4_ = fVar199 * (float)local_128._4_4_;
                            auVar139._8_4_ = fVar199 * fStack_120;
                            auVar139._12_4_ = fVar199 * fStack_11c;
                            auVar128._4_4_ = fVar194;
                            auVar128._0_4_ = fVar194;
                            auVar128._8_4_ = fVar194;
                            auVar128._12_4_ = fVar194;
                            auVar34 = vfmadd132ps_fma(auVar128,auVar139,local_118);
                            auVar120._4_4_ = fVar106;
                            auVar120._0_4_ = fVar106;
                            auVar120._8_4_ = fVar106;
                            auVar120._12_4_ = fVar106;
                            auVar34 = vfmadd132ps_fma(auVar120,auVar34,local_108);
                            auVar109._4_4_ = fVar201;
                            auVar109._0_4_ = fVar201;
                            auVar109._8_4_ = fVar201;
                            auVar109._12_4_ = fVar201;
                            auVar40 = vfmadd132ps_fma(auVar109,auVar34,local_f8);
                            auVar34 = vshufps_avx(auVar40,auVar40,0xc9);
                            auVar46 = vshufps_avx(auVar89._0_16_,auVar89._0_16_,0xc9);
                            auVar110._0_4_ = auVar40._0_4_ * auVar46._0_4_;
                            auVar110._4_4_ = auVar40._4_4_ * auVar46._4_4_;
                            auVar110._8_4_ = auVar40._8_4_ * auVar46._8_4_;
                            auVar110._12_4_ = auVar40._12_4_ * auVar46._12_4_;
                            auVar46 = vfmsub231ps_fma(auVar110,auVar89._0_16_,auVar34);
                            auVar34 = vshufps_avx(auVar46,auVar46,0xe9);
                            local_158 = vmovlps_avx(auVar34);
                            local_150 = auVar46._0_4_;
                            local_14c = vmovlps_avx(auVar45);
                            local_144 = (int)local_2d8;
                            local_140 = uVar31;
                            local_13c = context->user->instID[0];
                            local_138 = context->user->instPrimID[0];
                            ray->tfar = fVar198;
                            local_35c = -1;
                            local_2c8.valid = &local_35c;
                            local_2c8.geometryUserPtr = pGVar6->userPtr;
                            local_2c8.context = context->user;
                            local_2c8.hit = (RTCHitN *)&local_158;
                            local_2c8.N = 1;
                            local_2c8.ray = (RTCRayN *)ray;
                            if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d97a02:
                              auVar34 = auVar231._0_16_;
                              p_Var9 = context->args->filter;
                              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var9)(&local_2c8);
                                  auVar230 = ZEXT1664(local_298);
                                  auVar240 = ZEXT1664(local_328);
                                  auVar238 = ZEXT1664(local_318);
                                  auVar239 = ZEXT1664(local_358);
                                  auVar34 = vxorps_avx512vl(auVar34,auVar34);
                                  auVar231 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar235 = ZEXT1664(auVar34);
                                  auVar234 = ZEXT464(0x3f800000);
                                  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM19 = ZEXT3264(auVar59);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar233 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar232 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar241 = ZEXT1664(auVar34);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar237 = ZEXT3264(auVar89);
                                }
                                if (*local_2c8.valid == 0) goto LAB_01d97b52;
                              }
                              bVar10 = true;
                            }
                            else {
                              local_2e0 = context;
                              (*pGVar6->occlusionFilterN)(&local_2c8);
                              auVar230 = ZEXT1664(local_298);
                              auVar240 = ZEXT1664(local_328);
                              auVar238 = ZEXT1664(local_318);
                              auVar239 = ZEXT1664(local_358);
                              auVar34 = vxorps_avx512vl(auVar36,auVar36);
                              auVar231 = ZEXT1664(auVar34);
                              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar235 = ZEXT1664(auVar34);
                              auVar234 = ZEXT464(0x3f800000);
                              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              in_ZMM19 = ZEXT3264(auVar59);
                              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar233 = ZEXT1664(auVar34);
                              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar232 = ZEXT1664(auVar34);
                              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar241 = ZEXT1664(auVar34);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
                              auVar237 = ZEXT3264(auVar89);
                              context = local_2e0;
                              if (*local_2c8.valid != 0) goto LAB_01d97a02;
LAB_01d97b52:
                              bVar10 = false;
                            }
                            if (!bVar10) {
                              ray->tfar = fVar200;
                            }
                          }
                          bVar32 = (bool)(bVar32 | bVar10);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar30 = lVar30 + -1;
            } while (lVar30 != 0);
          }
        }
        else {
          auVar34 = vxorps_avx512vl(auVar39,auVar39);
          auVar231 = ZEXT1664(auVar34);
          auVar239 = ZEXT1664(local_358);
          auVar89._16_16_ = auVar78._16_16_;
          auVar89._0_16_ = local_348;
        }
      }
    } while (bVar12);
    auVar34 = vinsertps_avx(local_348,auVar44,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }